

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  byte bVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar76;
  ulong uVar77;
  long lVar78;
  Geometry *pGVar79;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar86;
  undefined1 auVar95 [16];
  undefined8 in_R10;
  ulong uVar80;
  long lVar81;
  long lVar82;
  byte bVar83;
  ulong uVar84;
  float fVar85;
  float fVar137;
  float fVar139;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar93 [16];
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar94 [16];
  float fVar141;
  float fVar144;
  float fVar145;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar146;
  undefined4 uVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined8 uVar166;
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  Geometry *local_618;
  RayHitK<8> *local_610;
  undefined1 (*local_608) [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  long local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  
  uVar73 = (ulong)(byte)prim[1];
  fVar170 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar171 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar172 = vsubps_avx(auVar87,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar178 = fVar170 * auVar172._0_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar87);
  fVar146 = fVar170 * auVar171._0_4_;
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar19);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar6);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar101 = vpmovsxbd_avx2(auVar95);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 * 0xc + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar103 = vpmovsxbd_avx2(auVar91);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar111 = vpmovsxbd_avx2(auVar89);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar73 * 0x13 + 6);
  auVar110 = vpmovsxbd_avx2(auVar88);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar73 * 0x14 + 6);
  auVar106 = vpmovsxbd_avx2(auVar7);
  auVar105 = vcvtdq2ps_avx(auVar106);
  auVar217._8_4_ = 1;
  auVar217._0_8_ = 0x100000001;
  auVar217._12_4_ = 1;
  auVar217._16_4_ = 1;
  auVar217._20_4_ = 1;
  auVar217._24_4_ = 1;
  auVar217._28_4_ = 1;
  auVar215._4_4_ = fVar146;
  auVar215._0_4_ = fVar146;
  auVar215._8_4_ = fVar146;
  auVar215._12_4_ = fVar146;
  auVar215._16_4_ = fVar146;
  auVar215._20_4_ = fVar146;
  auVar215._24_4_ = fVar146;
  auVar215._28_4_ = fVar146;
  auVar98 = ZEXT1632(CONCAT412(fVar170 * auVar171._12_4_,
                               CONCAT48(fVar170 * auVar171._8_4_,
                                        CONCAT44(fVar170 * auVar171._4_4_,fVar146))));
  auVar107 = vpermps_avx2(auVar217,auVar98);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = vpermps_avx512vl(auVar96,auVar98);
  fVar146 = auVar97._0_4_;
  auVar221._0_4_ = fVar146 * auVar100._0_4_;
  fVar160 = auVar97._4_4_;
  auVar221._4_4_ = fVar160 * auVar100._4_4_;
  fVar161 = auVar97._8_4_;
  auVar221._8_4_ = fVar161 * auVar100._8_4_;
  fVar162 = auVar97._12_4_;
  auVar221._12_4_ = fVar162 * auVar100._12_4_;
  fVar163 = auVar97._16_4_;
  auVar221._16_4_ = fVar163 * auVar100._16_4_;
  fVar164 = auVar97._20_4_;
  auVar221._20_4_ = fVar164 * auVar100._20_4_;
  fVar165 = auVar97._24_4_;
  auVar221._28_36_ = in_ZMM4._28_36_;
  auVar221._24_4_ = fVar165 * auVar100._24_4_;
  auVar98._4_4_ = auVar103._4_4_ * fVar160;
  auVar98._0_4_ = auVar103._0_4_ * fVar146;
  auVar98._8_4_ = auVar103._8_4_ * fVar161;
  auVar98._12_4_ = auVar103._12_4_ * fVar162;
  auVar98._16_4_ = auVar103._16_4_ * fVar163;
  auVar98._20_4_ = auVar103._20_4_ * fVar164;
  auVar98._24_4_ = auVar103._24_4_ * fVar165;
  auVar98._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = fVar160 * auVar105._4_4_;
  auVar106._0_4_ = fVar146 * auVar105._0_4_;
  auVar106._8_4_ = fVar161 * auVar105._8_4_;
  auVar106._12_4_ = fVar162 * auVar105._12_4_;
  auVar106._16_4_ = fVar163 * auVar105._16_4_;
  auVar106._20_4_ = fVar164 * auVar105._20_4_;
  auVar106._24_4_ = fVar165 * auVar105._24_4_;
  auVar106._28_4_ = auVar97._28_4_;
  auVar87 = vfmadd231ps_fma(auVar221._0_32_,auVar107,auVar99);
  auVar19 = vfmadd231ps_fma(auVar98,auVar107,auVar104);
  auVar6 = vfmadd231ps_fma(auVar106,auVar110,auVar107);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar215,auVar102);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar215,auVar101);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar111,auVar215);
  auVar216._4_4_ = fVar178;
  auVar216._0_4_ = fVar178;
  auVar216._8_4_ = fVar178;
  auVar216._12_4_ = fVar178;
  auVar216._16_4_ = fVar178;
  auVar216._20_4_ = fVar178;
  auVar216._24_4_ = fVar178;
  auVar216._28_4_ = fVar178;
  auVar107 = ZEXT1632(CONCAT412(fVar170 * auVar172._12_4_,
                                CONCAT48(fVar170 * auVar172._8_4_,
                                         CONCAT44(fVar170 * auVar172._4_4_,fVar178))));
  auVar106 = vpermps_avx2(auVar217,auVar107);
  auVar98 = vpermps_avx512vl(auVar96,auVar107);
  fVar170 = auVar98._0_4_;
  fVar146 = auVar98._4_4_;
  auVar107._4_4_ = fVar146 * auVar100._4_4_;
  auVar107._0_4_ = fVar170 * auVar100._0_4_;
  fVar160 = auVar98._8_4_;
  auVar107._8_4_ = fVar160 * auVar100._8_4_;
  fVar161 = auVar98._12_4_;
  auVar107._12_4_ = fVar161 * auVar100._12_4_;
  fVar162 = auVar98._16_4_;
  auVar107._16_4_ = fVar162 * auVar100._16_4_;
  fVar163 = auVar98._20_4_;
  auVar107._20_4_ = fVar163 * auVar100._20_4_;
  fVar164 = auVar98._24_4_;
  auVar107._24_4_ = fVar164 * auVar100._24_4_;
  auVar107._28_4_ = auVar100._28_4_;
  auVar181._0_4_ = fVar170 * auVar103._0_4_;
  auVar181._4_4_ = fVar146 * auVar103._4_4_;
  auVar181._8_4_ = fVar160 * auVar103._8_4_;
  auVar181._12_4_ = fVar161 * auVar103._12_4_;
  auVar181._16_4_ = fVar162 * auVar103._16_4_;
  auVar181._20_4_ = fVar163 * auVar103._20_4_;
  auVar181._24_4_ = fVar164 * auVar103._24_4_;
  auVar181._28_4_ = 0;
  auVar103._4_4_ = fVar146 * auVar105._4_4_;
  auVar103._0_4_ = fVar170 * auVar105._0_4_;
  auVar103._8_4_ = fVar160 * auVar105._8_4_;
  auVar103._12_4_ = fVar161 * auVar105._12_4_;
  auVar103._16_4_ = fVar162 * auVar105._16_4_;
  auVar103._20_4_ = fVar163 * auVar105._20_4_;
  auVar103._24_4_ = fVar164 * auVar105._24_4_;
  auVar103._28_4_ = auVar105._28_4_;
  auVar95 = vfmadd231ps_fma(auVar107,auVar106,auVar99);
  auVar90 = vfmadd231ps_fma(auVar181,auVar106,auVar104);
  auVar91 = vfmadd231ps_fma(auVar103,auVar106,auVar110);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar216,auVar102);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar216,auVar101);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar216,auVar111);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar207._16_4_ = 0x7fffffff;
  auVar207._20_4_ = 0x7fffffff;
  auVar207._24_4_ = 0x7fffffff;
  auVar207._28_4_ = 0x7fffffff;
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar202._16_4_ = 0x219392ef;
  auVar202._20_4_ = 0x219392ef;
  auVar202._24_4_ = 0x219392ef;
  auVar202._28_4_ = 0x219392ef;
  auVar102 = vandps_avx(auVar207,ZEXT1632(auVar87));
  uVar80 = vcmpps_avx512vl(auVar102,auVar202,1);
  bVar12 = (bool)((byte)uVar80 & 1);
  auVar96._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._0_4_;
  bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._4_4_;
  bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._8_4_;
  bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar207,ZEXT1632(auVar19));
  uVar80 = vcmpps_avx512vl(auVar102,auVar202,1);
  bVar12 = (bool)((byte)uVar80 & 1);
  auVar97._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._0_4_;
  bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._4_4_;
  bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._8_4_;
  bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar207,ZEXT1632(auVar6));
  uVar80 = vcmpps_avx512vl(auVar102,auVar202,1);
  bVar12 = (bool)((byte)uVar80 & 1);
  auVar102._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._0_4_;
  bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._4_4_;
  bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._8_4_;
  bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar6._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar96);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar221 = ZEXT3264(auVar100);
  auVar101 = vfnmadd213ps_avx512vl(auVar96,auVar99,auVar100);
  auVar87 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar101 = vfnmadd213ps_avx512vl(auVar97,auVar99,auVar100);
  auVar19 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar102);
  auVar102 = vfnmadd213ps_avx512vl(auVar102,auVar99,auVar100);
  auVar6 = vfmadd132ps_fma(auVar102,auVar99,auVar99);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar95));
  auVar111._4_4_ = auVar87._4_4_ * auVar102._4_4_;
  auVar111._0_4_ = auVar87._0_4_ * auVar102._0_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar102._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar102._12_4_;
  auVar111._16_4_ = auVar102._16_4_ * 0.0;
  auVar111._20_4_ = auVar102._20_4_ * 0.0;
  auVar111._24_4_ = auVar102._24_4_ * 0.0;
  auVar111._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar95));
  auVar190._0_4_ = auVar87._0_4_ * auVar102._0_4_;
  auVar190._4_4_ = auVar87._4_4_ * auVar102._4_4_;
  auVar190._8_4_ = auVar87._8_4_ * auVar102._8_4_;
  auVar190._12_4_ = auVar87._12_4_ * auVar102._12_4_;
  auVar190._16_4_ = auVar102._16_4_ * 0.0;
  auVar190._20_4_ = auVar102._20_4_ * 0.0;
  auVar190._24_4_ = auVar102._24_4_ * 0.0;
  auVar190._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0xe + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar90));
  auVar110._4_4_ = auVar19._4_4_ * auVar102._4_4_;
  auVar110._0_4_ = auVar19._0_4_ * auVar102._0_4_;
  auVar110._8_4_ = auVar19._8_4_ * auVar102._8_4_;
  auVar110._12_4_ = auVar19._12_4_ * auVar102._12_4_;
  auVar110._16_4_ = auVar102._16_4_ * 0.0;
  auVar110._20_4_ = auVar102._20_4_ * 0.0;
  auVar110._24_4_ = auVar102._24_4_ * 0.0;
  auVar110._28_4_ = auVar102._28_4_;
  auVar103 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar90));
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x15 + 6));
  auVar109._0_4_ = auVar19._0_4_ * auVar102._0_4_;
  auVar109._4_4_ = auVar19._4_4_ * auVar102._4_4_;
  auVar109._8_4_ = auVar19._8_4_ * auVar102._8_4_;
  auVar109._12_4_ = auVar19._12_4_ * auVar102._12_4_;
  auVar109._16_4_ = auVar102._16_4_ * 0.0;
  auVar109._20_4_ = auVar102._20_4_ * 0.0;
  auVar109._24_4_ = auVar102._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar102 = vcvtdq2ps_avx(auVar99);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar91));
  auVar105._4_4_ = auVar102._4_4_ * auVar6._4_4_;
  auVar105._0_4_ = auVar102._0_4_ * auVar6._0_4_;
  auVar105._8_4_ = auVar102._8_4_ * auVar6._8_4_;
  auVar105._12_4_ = auVar102._12_4_ * auVar6._12_4_;
  auVar105._16_4_ = auVar102._16_4_ * 0.0;
  auVar105._20_4_ = auVar102._20_4_ * 0.0;
  auVar105._24_4_ = auVar102._24_4_ * 0.0;
  auVar105._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar91));
  auVar108._0_4_ = auVar6._0_4_ * auVar102._0_4_;
  auVar108._4_4_ = auVar6._4_4_ * auVar102._4_4_;
  auVar108._8_4_ = auVar6._8_4_ * auVar102._8_4_;
  auVar108._12_4_ = auVar6._12_4_ * auVar102._12_4_;
  auVar108._16_4_ = auVar102._16_4_ * 0.0;
  auVar108._20_4_ = auVar102._20_4_ * 0.0;
  auVar108._24_4_ = auVar102._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar111,auVar190);
  auVar99 = vpminsd_avx2(auVar110,auVar109);
  auVar102 = vmaxps_avx(auVar102,auVar99);
  auVar99 = vpminsd_avx2(auVar105,auVar108);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar100._4_4_ = uVar3;
  auVar100._0_4_ = uVar3;
  auVar100._8_4_ = uVar3;
  auVar100._12_4_ = uVar3;
  auVar100._16_4_ = uVar3;
  auVar100._20_4_ = uVar3;
  auVar100._24_4_ = uVar3;
  auVar100._28_4_ = uVar3;
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar102 = vmaxps_avx(auVar102,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_520 = vmulps_avx512vl(auVar102,auVar99);
  auVar222 = ZEXT3264(local_520);
  auVar102 = vpmaxsd_avx2(auVar111,auVar190);
  auVar99 = vpmaxsd_avx2(auVar110,auVar109);
  auVar102 = vminps_avx(auVar102,auVar99);
  auVar99 = vpmaxsd_avx2(auVar105,auVar108);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar101._4_4_ = uVar3;
  auVar101._0_4_ = uVar3;
  auVar101._8_4_ = uVar3;
  auVar101._12_4_ = uVar3;
  auVar101._16_4_ = uVar3;
  auVar101._20_4_ = uVar3;
  auVar101._24_4_ = uVar3;
  auVar101._28_4_ = uVar3;
  auVar99 = vminps_avx512vl(auVar99,auVar101);
  auVar102 = vminps_avx(auVar102,auVar99);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar104);
  uVar166 = vcmpps_avx512vl(local_520,auVar102,2);
  uVar20 = vpcmpgtd_avx512vl(auVar103,_DAT_01fb4ba0);
  uVar80 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar166 & (byte)uVar20));
  local_608 = (undefined1 (*) [32])&local_140;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar223 = ZEXT1664(auVar87);
  local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = ray;
  do {
    if (uVar80 == 0) {
      return;
    }
    lVar78 = 0;
    for (uVar74 = uVar80; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      lVar78 = lVar78 + 1;
    }
    uVar80 = uVar80 - 1 & uVar80;
    uVar3 = *(undefined4 *)(prim + lVar78 * 4 + 6);
    uVar74 = (ulong)(uint)((int)lVar78 << 6);
    uVar8 = *(uint *)(prim + 2);
    pGVar79 = (context->scene->geometries).items[uVar8].ptr;
    local_600._0_8_ = pGVar79;
    auVar87 = *(undefined1 (*) [16])(prim + uVar74 + uVar73 * 0x19 + 0x16);
    if (uVar80 != 0) {
      uVar77 = uVar80 - 1 & uVar80;
      for (uVar84 = uVar80; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
      if (uVar77 != 0) {
        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar19 = *(undefined1 (*) [16])(prim + uVar74 + uVar73 * 0x19 + 0x26);
    auVar6 = *(undefined1 (*) [16])(prim + uVar74 + uVar73 * 0x19 + 0x36);
    auVar95 = *(undefined1 (*) [16])(prim + uVar74 + uVar73 * 0x19 + 0x46);
    iVar9 = (int)pGVar79[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar89 = vsubps_avx(auVar87,auVar90);
    uVar147 = auVar89._0_4_;
    auVar171._4_4_ = uVar147;
    auVar171._0_4_ = uVar147;
    auVar171._8_4_ = uVar147;
    auVar171._12_4_ = uVar147;
    auVar91 = vshufps_avx(auVar89,auVar89,0x55);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    fVar170 = pre->ray_space[k].vz.field_0.m128[0];
    fVar146 = pre->ray_space[k].vz.field_0.m128[1];
    fVar160 = pre->ray_space[k].vz.field_0.m128[2];
    fVar161 = pre->ray_space[k].vz.field_0.m128[3];
    auVar92._0_4_ = fVar170 * auVar89._0_4_;
    auVar92._4_4_ = fVar146 * auVar89._4_4_;
    auVar92._8_4_ = fVar160 * auVar89._8_4_;
    auVar92._12_4_ = fVar161 * auVar89._12_4_;
    auVar91 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar91);
    auVar7 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar171);
    auVar91 = vshufps_avx(auVar87,auVar87,0xff);
    auVar88 = vsubps_avx(auVar19,auVar90);
    uVar147 = auVar88._0_4_;
    auVar179._4_4_ = uVar147;
    auVar179._0_4_ = uVar147;
    auVar179._8_4_ = uVar147;
    auVar179._12_4_ = uVar147;
    auVar89 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar208._0_4_ = fVar170 * auVar88._0_4_;
    auVar208._4_4_ = fVar146 * auVar88._4_4_;
    auVar208._8_4_ = fVar160 * auVar88._8_4_;
    auVar208._12_4_ = fVar161 * auVar88._12_4_;
    auVar89 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar89);
    auVar171 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar179);
    auVar88 = vsubps_avx512vl(auVar6,auVar90);
    uVar147 = auVar88._0_4_;
    auVar180._4_4_ = uVar147;
    auVar180._0_4_ = uVar147;
    auVar180._8_4_ = uVar147;
    auVar180._12_4_ = uVar147;
    auVar89 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar93._0_4_ = fVar170 * auVar88._0_4_;
    auVar93._4_4_ = fVar146 * auVar88._4_4_;
    auVar93._8_4_ = fVar160 * auVar88._8_4_;
    auVar93._12_4_ = fVar161 * auVar88._12_4_;
    auVar89 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar89);
    auVar88 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar180);
    auVar89 = vsubps_avx512vl(auVar95,auVar90);
    uVar147 = auVar89._0_4_;
    auVar172._4_4_ = uVar147;
    auVar172._0_4_ = uVar147;
    auVar172._8_4_ = uVar147;
    auVar172._12_4_ = uVar147;
    auVar90 = vshufps_avx(auVar89,auVar89,0x55);
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar94._0_4_ = fVar170 * auVar89._0_4_;
    auVar94._4_4_ = fVar146 * auVar89._4_4_;
    auVar94._8_4_ = fVar160 * auVar89._8_4_;
    auVar94._12_4_ = fVar161 * auVar89._12_4_;
    auVar90 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar90);
    auVar89 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar172);
    lVar78 = (long)iVar9;
    lVar81 = lVar78 * 0x44;
    auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar81);
    uVar147 = auVar7._0_4_;
    local_420._4_4_ = uVar147;
    local_420._0_4_ = uVar147;
    local_420._8_4_ = uVar147;
    local_420._12_4_ = uVar147;
    local_420._16_4_ = uVar147;
    local_420._20_4_ = uVar147;
    local_420._24_4_ = uVar147;
    local_420._28_4_ = uVar147;
    auVar152._8_4_ = 1;
    auVar152._0_8_ = 0x100000001;
    auVar152._12_4_ = 1;
    auVar152._16_4_ = 1;
    auVar152._20_4_ = 1;
    auVar152._24_4_ = 1;
    auVar152._28_4_ = 1;
    local_440 = vpermps_avx2(auVar152,ZEXT1632(auVar7));
    auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x484);
    local_460 = vbroadcastss_avx512vl(auVar171);
    local_480 = vpermps_avx512vl(auVar152,ZEXT1632(auVar171));
    auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x908);
    local_4a0 = vbroadcastss_avx512vl(auVar88);
    local_4c0 = vpermps_avx512vl(auVar152,ZEXT1632(auVar88));
    auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0xd8c);
    fVar163 = auVar89._0_4_;
    local_4e0._4_4_ = fVar163;
    local_4e0._0_4_ = fVar163;
    fStack_4d8 = fVar163;
    fStack_4d4 = fVar163;
    fStack_4d0 = fVar163;
    fStack_4cc = fVar163;
    fStack_4c8 = fVar163;
    register0x0000139c = fVar163;
    _local_500 = vpermps_avx512vl(auVar152,ZEXT1632(auVar89));
    auVar104 = vmulps_avx512vl(_local_4e0,auVar101);
    auVar103 = vmulps_avx512vl(_local_500,auVar101);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_4a0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_4c0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,local_460);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_480);
    auVar105 = vfmadd231ps_avx512vl(auVar104,auVar102,local_420);
    auVar205 = ZEXT3264(auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar102,local_440);
    auVar197 = ZEXT3264(auVar106);
    auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar81);
    auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x484);
    auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x908);
    auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0xd8c);
    auVar107 = vmulps_avx512vl(_local_4e0,auVar110);
    auVar98 = vmulps_avx512vl(_local_500,auVar110);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_4a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_4c0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_460);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_480);
    auVar172 = vfmadd231ps_fma(auVar107,auVar104,local_420);
    auVar206 = ZEXT1664(auVar172);
    auVar179 = vfmadd231ps_fma(auVar98,auVar104,local_440);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar172),auVar105);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar179),auVar106);
    auVar96 = vmulps_avx512vl(auVar106,auVar107);
    auVar97 = vmulps_avx512vl(auVar105,auVar98);
    auVar96 = vsubps_avx512vl(auVar96,auVar97);
    auVar90 = vshufps_avx(auVar19,auVar19,0xff);
    uVar166 = auVar91._0_8_;
    local_80._8_8_ = uVar166;
    local_80._0_8_ = uVar166;
    local_80._16_8_ = uVar166;
    local_80._24_8_ = uVar166;
    local_a0 = vbroadcastsd_avx512vl(auVar90);
    auVar90 = vshufps_avx512vl(auVar6,auVar6,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar90);
    auVar90 = vshufps_avx512vl(auVar95,auVar95,0xff);
    uVar166 = auVar90._0_8_;
    local_e0._8_8_ = uVar166;
    local_e0._0_8_ = uVar166;
    local_e0._16_8_ = uVar166;
    local_e0._24_8_ = uVar166;
    auVar97 = vmulps_avx512vl(local_e0,auVar101);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_a0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_80);
    auVar108 = vmulps_avx512vl(local_e0,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_c0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_a0);
    auVar180 = vfmadd231ps_fma(auVar108,auVar104,local_80);
    auVar108 = vmulps_avx512vl(auVar98,auVar98);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar109 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar180));
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    uVar166 = vcmpps_avx512vl(auVar96,auVar108,2);
    auVar90 = vblendps_avx(auVar7,auVar87,8);
    auVar208 = auVar223._0_16_;
    auVar91 = vandps_avx512vl(auVar90,auVar208);
    auVar90 = vblendps_avx(auVar171,auVar19,8);
    auVar90 = vandps_avx512vl(auVar90,auVar208);
    auVar91 = vmaxps_avx(auVar91,auVar90);
    auVar90 = vblendps_avx(auVar88,auVar6,8);
    auVar92 = vandps_avx512vl(auVar90,auVar208);
    auVar90 = vblendps_avx(auVar89,auVar95,8);
    auVar90 = vandps_avx512vl(auVar90,auVar208);
    auVar90 = vmaxps_avx(auVar92,auVar90);
    auVar90 = vmaxps_avx(auVar91,auVar90);
    auVar91 = vmovshdup_avx(auVar90);
    auVar91 = vmaxss_avx(auVar91,auVar90);
    auVar90 = vshufpd_avx(auVar90,auVar90,1);
    auVar90 = vmaxss_avx(auVar90,auVar91);
    auVar91 = vcvtsi2ss_avx512f(auVar95,iVar9);
    local_580._0_16_ = auVar91;
    auVar212._0_4_ = auVar91._0_4_;
    auVar212._4_4_ = auVar212._0_4_;
    auVar212._8_4_ = auVar212._0_4_;
    auVar212._12_4_ = auVar212._0_4_;
    auVar212._16_4_ = auVar212._0_4_;
    auVar212._20_4_ = auVar212._0_4_;
    auVar212._24_4_ = auVar212._0_4_;
    auVar212._28_4_ = auVar212._0_4_;
    uVar20 = vcmpps_avx512vl(auVar212,_DAT_01f7b060,0xe);
    bVar83 = (byte)uVar166 & (byte)uVar20;
    fVar170 = auVar90._0_4_ * 4.7683716e-07;
    local_630 = ZEXT416((uint)fVar170);
    auVar213._8_4_ = 2;
    auVar213._0_8_ = 0x200000002;
    auVar213._12_4_ = 2;
    auVar213._16_4_ = 2;
    auVar213._20_4_ = 2;
    auVar213._24_4_ = 2;
    auVar213._28_4_ = 2;
    auVar96 = vpermps_avx512vl(auVar213,ZEXT1632(auVar7));
    local_240 = vpermps_avx2(auVar213,ZEXT1632(auVar171));
    local_260 = vpermps_avx2(auVar213,ZEXT1632(auVar88));
    local_280 = vpermps_avx2(auVar213,ZEXT1632(auVar89));
    uVar75 = *(uint *)(ray + k * 4 + 0x60);
    local_640 = ZEXT416(uVar75);
    local_2a0 = vpbroadcastd_avx512vl();
    local_2c0 = vpbroadcastd_avx512vl();
    local_680 = auVar19._0_8_;
    uStack_678 = auVar19._8_8_;
    local_690 = auVar6._0_8_;
    uStack_688 = auVar6._8_8_;
    local_6a0._0_4_ = auVar95._0_4_;
    fVar146 = (float)local_6a0;
    local_6a0._4_4_ = auVar95._4_4_;
    fVar160 = local_6a0._4_4_;
    uStack_698._0_4_ = auVar95._8_4_;
    fVar161 = (float)uStack_698;
    uStack_698._4_4_ = auVar95._12_4_;
    fVar162 = uStack_698._4_4_;
    local_6a0 = auVar95._0_8_;
    uStack_698 = auVar95._8_8_;
    if (bVar83 != 0) {
      auVar110 = vmulps_avx512vl(local_280,auVar110);
      auVar111 = vfmadd213ps_avx512vl(auVar111,local_260,auVar110);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_240,auVar111);
      auVar103 = vfmadd213ps_avx512vl(auVar104,auVar96,auVar103);
      auVar101 = vmulps_avx512vl(local_280,auVar101);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_260,auVar101);
      auVar111 = vfmadd213ps_avx512vl(auVar99,local_240,auVar100);
      auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1694);
      auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1f9c);
      auVar111 = vfmadd213ps_avx512vl(auVar102,auVar96,auVar111);
      auVar209._0_4_ = fVar163 * auVar104._0_4_;
      auVar209._4_4_ = fVar163 * auVar104._4_4_;
      auVar209._8_4_ = fVar163 * auVar104._8_4_;
      auVar209._12_4_ = fVar163 * auVar104._12_4_;
      auVar209._16_4_ = fVar163 * auVar104._16_4_;
      auVar209._20_4_ = fVar163 * auVar104._20_4_;
      auVar209._24_4_ = fVar163 * auVar104._24_4_;
      auVar209._28_4_ = 0;
      auVar102 = vmulps_avx512vl(_local_500,auVar104);
      auVar104 = vmulps_avx512vl(local_280,auVar104);
      auVar110 = vfmadd231ps_avx512vl(auVar209,auVar101,local_4a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_4c0);
      auVar101 = vfmadd231ps_avx512vl(auVar104,local_260,auVar101);
      auVar104 = vfmadd231ps_avx512vl(auVar110,auVar100,local_460);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_480);
      auVar110 = vfmadd231ps_avx512vl(auVar101,local_240,auVar100);
      auVar95 = vfmadd231ps_fma(auVar104,auVar99,local_420);
      auVar104 = vfmadd231ps_avx512vl(auVar102,auVar99,local_440);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1b18);
      auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1f9c);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar99);
      auVar32._4_4_ = fVar163 * auVar101._4_4_;
      auVar32._0_4_ = fVar163 * auVar101._0_4_;
      auVar32._8_4_ = fVar163 * auVar101._8_4_;
      auVar32._12_4_ = fVar163 * auVar101._12_4_;
      auVar32._16_4_ = fVar163 * auVar101._16_4_;
      auVar32._20_4_ = fVar163 * auVar101._20_4_;
      auVar32._24_4_ = fVar163 * auVar101._24_4_;
      auVar32._28_4_ = auVar99._28_4_;
      auVar99 = vmulps_avx512vl(_local_500,auVar101);
      auVar101 = vmulps_avx512vl(local_280,auVar101);
      auVar223 = ZEXT1664(auVar208);
      auVar108 = vfmadd231ps_avx512vl(auVar32,auVar100,local_4a0);
      auVar109 = vfmadd231ps_avx512vl(auVar99,auVar100,local_4c0);
      auVar220 = ZEXT3264(auVar96);
      auVar100 = vfmadd231ps_avx512vl(auVar101,local_260,auVar100);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1694);
      auVar101 = vfmadd231ps_avx512vl(auVar108,auVar99,local_460);
      auVar108 = vfmadd231ps_avx512vl(auVar109,auVar99,local_480);
      auVar99 = vfmadd231ps_avx512vl(auVar100,local_240,auVar99);
      auVar222 = ZEXT3264(auVar222._0_32_);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar221 = ZEXT3264(auVar109);
      auVar90 = vfmadd231ps_fma(auVar101,auVar102,local_420);
      auVar100 = vfmadd231ps_avx512vl(auVar108,auVar102,local_440);
      auVar101 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar102);
      auVar218._8_4_ = 0x7fffffff;
      auVar218._0_8_ = 0x7fffffff7fffffff;
      auVar218._12_4_ = 0x7fffffff;
      auVar218._16_4_ = 0x7fffffff;
      auVar218._20_4_ = 0x7fffffff;
      auVar218._24_4_ = 0x7fffffff;
      auVar218._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(ZEXT1632(auVar95),auVar218);
      auVar99 = vandps_avx(auVar104,auVar218);
      auVar99 = vmaxps_avx(auVar102,auVar99);
      auVar102 = vandps_avx(auVar110,auVar218);
      auVar102 = vmaxps_avx(auVar99,auVar102);
      auVar214._4_4_ = fVar170;
      auVar214._0_4_ = fVar170;
      auVar214._8_4_ = fVar170;
      auVar214._12_4_ = fVar170;
      auVar214._16_4_ = fVar170;
      auVar214._20_4_ = fVar170;
      auVar214._24_4_ = fVar170;
      auVar214._28_4_ = fVar170;
      uVar74 = vcmpps_avx512vl(auVar102,auVar214,1);
      bVar12 = (bool)((byte)uVar74 & 1);
      auVar112._0_4_ = (float)((uint)bVar12 * auVar107._0_4_ | (uint)!bVar12 * auVar95._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar95._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar95._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar95._12_4_);
      fVar170 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar107._16_4_);
      auVar112._16_4_ = fVar170;
      fVar163 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar107._20_4_);
      auVar112._20_4_ = fVar163;
      fVar164 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar107._24_4_);
      auVar112._24_4_ = fVar164;
      uVar76 = (uint)(byte)(uVar74 >> 7) * auVar107._28_4_;
      auVar112._28_4_ = uVar76;
      bVar12 = (bool)((byte)uVar74 & 1);
      auVar113._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar104._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar104._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar104._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar104._12_4_);
      bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar104._16_4_);
      bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar104._20_4_);
      bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar104._24_4_);
      bVar12 = SUB81(uVar74 >> 7,0);
      auVar113._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar104._28_4_;
      auVar102 = vandps_avx(auVar218,ZEXT1632(auVar90));
      auVar99 = vandps_avx(auVar100,auVar218);
      auVar99 = vmaxps_avx(auVar102,auVar99);
      auVar102 = vandps_avx(auVar101,auVar218);
      auVar102 = vmaxps_avx(auVar99,auVar102);
      uVar74 = vcmpps_avx512vl(auVar102,auVar214,1);
      bVar12 = (bool)((byte)uVar74 & 1);
      auVar114._0_4_ = (float)((uint)bVar12 * auVar107._0_4_ | (uint)!bVar12 * auVar90._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar90._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar90._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar90._12_4_);
      fVar165 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar107._16_4_);
      auVar114._16_4_ = fVar165;
      fVar183 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar107._20_4_);
      auVar114._20_4_ = fVar183;
      fVar178 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar107._24_4_);
      auVar114._24_4_ = fVar178;
      auVar114._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar107._28_4_;
      bVar12 = (bool)((byte)uVar74 & 1);
      auVar115._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar100._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar100._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar100._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar100._12_4_);
      bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar100._16_4_);
      bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar100._20_4_);
      bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar100._24_4_);
      bVar12 = SUB81(uVar74 >> 7,0);
      auVar115._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar100._28_4_;
      auVar93 = vxorps_avx512vl(local_460._0_16_,local_460._0_16_);
      auVar102 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar93));
      auVar95 = vfmadd231ps_fma(auVar102,auVar113,auVar113);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
      fVar85 = auVar102._0_4_;
      fVar86 = auVar102._4_4_;
      fVar137 = auVar102._8_4_;
      fVar138 = auVar102._12_4_;
      fVar139 = auVar102._16_4_;
      fVar140 = auVar102._20_4_;
      fVar142 = auVar102._24_4_;
      auVar33._4_4_ = fVar86 * fVar86 * fVar86 * auVar95._4_4_ * -0.5;
      auVar33._0_4_ = fVar85 * fVar85 * fVar85 * auVar95._0_4_ * -0.5;
      auVar33._8_4_ = fVar137 * fVar137 * fVar137 * auVar95._8_4_ * -0.5;
      auVar33._12_4_ = fVar138 * fVar138 * fVar138 * auVar95._12_4_ * -0.5;
      auVar33._16_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar33._20_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar33._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar33._28_4_ = 0;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar100 = vfmadd231ps_avx512vl(auVar33,auVar99,auVar102);
      auVar34._4_4_ = auVar113._4_4_ * auVar100._4_4_;
      auVar34._0_4_ = auVar113._0_4_ * auVar100._0_4_;
      auVar34._8_4_ = auVar113._8_4_ * auVar100._8_4_;
      auVar34._12_4_ = auVar113._12_4_ * auVar100._12_4_;
      auVar34._16_4_ = auVar113._16_4_ * auVar100._16_4_;
      auVar34._20_4_ = auVar113._20_4_ * auVar100._20_4_;
      auVar34._24_4_ = auVar113._24_4_ * auVar100._24_4_;
      auVar34._28_4_ = auVar102._28_4_;
      auVar35._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
      auVar35._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
      auVar35._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
      auVar35._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
      auVar35._16_4_ = auVar100._16_4_ * -fVar170;
      auVar35._20_4_ = auVar100._20_4_ * -fVar163;
      auVar35._24_4_ = auVar100._24_4_ * -fVar164;
      auVar35._28_4_ = uVar76 ^ 0x80000000;
      auVar102 = vmulps_avx512vl(auVar100,ZEXT1632(auVar93));
      auVar107 = ZEXT1632(auVar93);
      auVar101 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar107);
      auVar95 = vfmadd231ps_fma(auVar101,auVar115,auVar115);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
      fVar170 = auVar101._0_4_;
      fVar163 = auVar101._4_4_;
      fVar164 = auVar101._8_4_;
      fVar85 = auVar101._12_4_;
      fVar86 = auVar101._16_4_;
      fVar137 = auVar101._20_4_;
      fVar138 = auVar101._24_4_;
      auVar36._4_4_ = fVar163 * fVar163 * fVar163 * auVar95._4_4_ * -0.5;
      auVar36._0_4_ = fVar170 * fVar170 * fVar170 * auVar95._0_4_ * -0.5;
      auVar36._8_4_ = fVar164 * fVar164 * fVar164 * auVar95._8_4_ * -0.5;
      auVar36._12_4_ = fVar85 * fVar85 * fVar85 * auVar95._12_4_ * -0.5;
      auVar36._16_4_ = fVar86 * fVar86 * fVar86 * -0.0;
      auVar36._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar36._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar36._28_4_ = 0;
      auVar99 = vfmadd231ps_avx512vl(auVar36,auVar99,auVar101);
      auVar37._4_4_ = auVar115._4_4_ * auVar99._4_4_;
      auVar37._0_4_ = auVar115._0_4_ * auVar99._0_4_;
      auVar37._8_4_ = auVar115._8_4_ * auVar99._8_4_;
      auVar37._12_4_ = auVar115._12_4_ * auVar99._12_4_;
      auVar37._16_4_ = auVar115._16_4_ * auVar99._16_4_;
      auVar37._20_4_ = auVar115._20_4_ * auVar99._20_4_;
      auVar37._24_4_ = auVar115._24_4_ * auVar99._24_4_;
      auVar37._28_4_ = auVar101._28_4_;
      auVar38._4_4_ = -auVar114._4_4_ * auVar99._4_4_;
      auVar38._0_4_ = -auVar114._0_4_ * auVar99._0_4_;
      auVar38._8_4_ = -auVar114._8_4_ * auVar99._8_4_;
      auVar38._12_4_ = -auVar114._12_4_ * auVar99._12_4_;
      auVar38._16_4_ = -fVar165 * auVar99._16_4_;
      auVar38._20_4_ = -fVar183 * auVar99._20_4_;
      auVar38._24_4_ = -fVar178 * auVar99._24_4_;
      auVar38._28_4_ = auVar100._28_4_;
      auVar99 = vmulps_avx512vl(auVar99,auVar107);
      auVar95 = vfmadd213ps_fma(auVar34,auVar97,auVar105);
      auVar90 = vfmadd213ps_fma(auVar35,auVar97,auVar106);
      auVar100 = vfmadd213ps_avx512vl(auVar102,auVar97,auVar111);
      auVar101 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar180),ZEXT1632(auVar172));
      auVar171 = vfnmadd213ps_fma(auVar34,auVar97,auVar105);
      auVar110 = ZEXT1632(auVar180);
      auVar91 = vfmadd213ps_fma(auVar38,auVar110,ZEXT1632(auVar179));
      auVar92 = vfnmadd213ps_fma(auVar35,auVar97,auVar106);
      auVar89 = vfmadd213ps_fma(auVar99,auVar110,auVar103);
      auVar104 = vfnmadd231ps_avx512vl(auVar111,auVar97,auVar102);
      auVar172 = vfnmadd213ps_fma(auVar37,auVar110,ZEXT1632(auVar172));
      auVar179 = vfnmadd213ps_fma(auVar38,auVar110,ZEXT1632(auVar179));
      auVar208 = vfnmadd231ps_fma(auVar103,ZEXT1632(auVar180),auVar99);
      auVar99 = vsubps_avx512vl(auVar101,ZEXT1632(auVar171));
      auVar102 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar92));
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar89),auVar104);
      auVar111 = vmulps_avx512vl(auVar102,auVar104);
      auVar88 = vfmsub231ps_fma(auVar111,ZEXT1632(auVar92),auVar103);
      auVar39._4_4_ = auVar171._4_4_ * auVar103._4_4_;
      auVar39._0_4_ = auVar171._0_4_ * auVar103._0_4_;
      auVar39._8_4_ = auVar171._8_4_ * auVar103._8_4_;
      auVar39._12_4_ = auVar171._12_4_ * auVar103._12_4_;
      auVar39._16_4_ = auVar103._16_4_ * 0.0;
      auVar39._20_4_ = auVar103._20_4_ * 0.0;
      auVar39._24_4_ = auVar103._24_4_ * 0.0;
      auVar39._28_4_ = auVar103._28_4_;
      auVar103 = vfmsub231ps_avx512vl(auVar39,auVar104,auVar99);
      auVar40._4_4_ = auVar92._4_4_ * auVar99._4_4_;
      auVar40._0_4_ = auVar92._0_4_ * auVar99._0_4_;
      auVar40._8_4_ = auVar92._8_4_ * auVar99._8_4_;
      auVar40._12_4_ = auVar92._12_4_ * auVar99._12_4_;
      auVar40._16_4_ = auVar99._16_4_ * 0.0;
      auVar40._20_4_ = auVar99._20_4_ * 0.0;
      auVar40._24_4_ = auVar99._24_4_ * 0.0;
      auVar40._28_4_ = auVar99._28_4_;
      auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar171),auVar102);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar107,auVar103);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,ZEXT1632(auVar88));
      auVar98 = ZEXT1632(auVar93);
      uVar74 = vcmpps_avx512vl(auVar102,auVar98,2);
      bVar72 = (byte)uVar74;
      fVar85 = (float)((uint)(bVar72 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar172._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      fVar137 = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar172._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      fVar139 = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar172._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      fVar142 = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar172._12_4_);
      auVar111 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(fVar137,fVar85))));
      fVar86 = (float)((uint)(bVar72 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar179._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      fVar138 = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar179._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      fVar140 = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar179._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      fVar143 = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar179._12_4_);
      auVar110 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar138,fVar86))));
      auVar116._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar208._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar208._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar208._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar208._12_4_);
      fVar164 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar100._16_4_);
      auVar116._16_4_ = fVar164;
      fVar163 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar100._20_4_);
      auVar116._20_4_ = fVar163;
      fVar170 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar100._24_4_);
      auVar116._24_4_ = fVar170;
      iVar1 = (uint)(byte)(uVar74 >> 7) * auVar100._28_4_;
      auVar116._28_4_ = iVar1;
      auVar99 = vblendmps_avx512vl(ZEXT1632(auVar171),auVar101);
      auVar117._0_4_ =
           (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar90._0_4_;
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar90._4_4_;
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar90._8_4_;
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar90._12_4_;
      auVar117._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar99._16_4_;
      auVar117._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar99._20_4_;
      auVar117._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar99._24_4_;
      auVar117._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar99._28_4_;
      auVar99 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
      auVar118._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar88._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar88._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar88._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar88._12_4_);
      fVar183 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar99._16_4_);
      auVar118._16_4_ = fVar183;
      fVar165 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar99._20_4_);
      auVar118._20_4_ = fVar165;
      fVar178 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar99._24_4_);
      auVar118._24_4_ = fVar178;
      auVar118._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar99._28_4_;
      auVar99 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar89));
      auVar119._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar100._0_4_);
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar100._4_4_);
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar100._8_4_);
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar100._12_4_);
      bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar119._16_4_ = (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar100._16_4_);
      bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar119._20_4_ = (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar100._20_4_);
      bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar119._24_4_ = (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar100._24_4_);
      bVar12 = SUB81(uVar74 >> 7,0);
      auVar119._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar100._28_4_;
      auVar120._0_4_ =
           (uint)(bVar72 & 1) * (int)auVar171._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar101._0_4_;
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar12 * (int)auVar171._4_4_ | (uint)!bVar12 * auVar101._4_4_;
      bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar12 * (int)auVar171._8_4_ | (uint)!bVar12 * auVar101._8_4_;
      bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar12 * (int)auVar171._12_4_ | (uint)!bVar12 * auVar101._12_4_;
      auVar120._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar101._16_4_;
      auVar120._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar101._20_4_;
      auVar120._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar101._24_4_;
      auVar120._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar101._28_4_;
      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar121._0_4_ =
           (uint)(bVar72 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar89._0_4_;
      bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar89._4_4_;
      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar89._8_4_;
      bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar89._12_4_;
      auVar121._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar104._16_4_;
      auVar121._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar104._20_4_;
      auVar121._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar104._24_4_;
      iVar2 = (uint)(byte)(uVar74 >> 7) * auVar104._28_4_;
      auVar121._28_4_ = iVar2;
      auVar105 = vsubps_avx512vl(auVar120,auVar111);
      auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar92._12_4_ |
                                              (uint)!bVar15 * auVar91._12_4_,
                                              CONCAT48((uint)bVar14 * (int)auVar92._8_4_ |
                                                       (uint)!bVar14 * auVar91._8_4_,
                                                       CONCAT44((uint)bVar12 * (int)auVar92._4_4_ |
                                                                (uint)!bVar12 * auVar91._4_4_,
                                                                (uint)(bVar72 & 1) *
                                                                (int)auVar92._0_4_ |
                                                                (uint)!(bool)(bVar72 & 1) *
                                                                auVar91._0_4_)))),auVar110);
      auVar205 = ZEXT3264(auVar99);
      auVar100 = vsubps_avx(auVar121,auVar116);
      auVar101 = vsubps_avx(auVar111,auVar117);
      auVar206 = ZEXT3264(auVar101);
      auVar104 = vsubps_avx(auVar110,auVar118);
      auVar103 = vsubps_avx(auVar116,auVar119);
      auVar41._4_4_ = auVar100._4_4_ * fVar137;
      auVar41._0_4_ = auVar100._0_4_ * fVar85;
      auVar41._8_4_ = auVar100._8_4_ * fVar139;
      auVar41._12_4_ = auVar100._12_4_ * fVar142;
      auVar41._16_4_ = auVar100._16_4_ * 0.0;
      auVar41._20_4_ = auVar100._20_4_ * 0.0;
      auVar41._24_4_ = auVar100._24_4_ * 0.0;
      auVar41._28_4_ = iVar2;
      auVar95 = vfmsub231ps_fma(auVar41,auVar116,auVar105);
      auVar42._4_4_ = fVar138 * auVar105._4_4_;
      auVar42._0_4_ = fVar86 * auVar105._0_4_;
      auVar42._8_4_ = fVar140 * auVar105._8_4_;
      auVar42._12_4_ = fVar143 * auVar105._12_4_;
      auVar42._16_4_ = auVar105._16_4_ * 0.0;
      auVar42._20_4_ = auVar105._20_4_ * 0.0;
      auVar42._24_4_ = auVar105._24_4_ * 0.0;
      auVar42._28_4_ = auVar102._28_4_;
      auVar90 = vfmsub231ps_fma(auVar42,auVar111,auVar99);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar98,ZEXT1632(auVar95));
      auVar191._0_4_ = auVar99._0_4_ * auVar116._0_4_;
      auVar191._4_4_ = auVar99._4_4_ * auVar116._4_4_;
      auVar191._8_4_ = auVar99._8_4_ * auVar116._8_4_;
      auVar191._12_4_ = auVar99._12_4_ * auVar116._12_4_;
      auVar191._16_4_ = auVar99._16_4_ * fVar164;
      auVar191._20_4_ = auVar99._20_4_ * fVar163;
      auVar191._24_4_ = auVar99._24_4_ * fVar170;
      auVar191._28_4_ = 0;
      auVar95 = vfmsub231ps_fma(auVar191,auVar110,auVar100);
      auVar106 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar95));
      auVar102 = vmulps_avx512vl(auVar103,auVar117);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar101,auVar119);
      auVar43._4_4_ = auVar104._4_4_ * auVar119._4_4_;
      auVar43._0_4_ = auVar104._0_4_ * auVar119._0_4_;
      auVar43._8_4_ = auVar104._8_4_ * auVar119._8_4_;
      auVar43._12_4_ = auVar104._12_4_ * auVar119._12_4_;
      auVar43._16_4_ = auVar104._16_4_ * auVar119._16_4_;
      auVar43._20_4_ = auVar104._20_4_ * auVar119._20_4_;
      auVar43._24_4_ = auVar104._24_4_ * auVar119._24_4_;
      auVar43._28_4_ = auVar119._28_4_;
      auVar95 = vfmsub231ps_fma(auVar43,auVar118,auVar103);
      auVar192._0_4_ = auVar118._0_4_ * auVar101._0_4_;
      auVar192._4_4_ = auVar118._4_4_ * auVar101._4_4_;
      auVar192._8_4_ = auVar118._8_4_ * auVar101._8_4_;
      auVar192._12_4_ = auVar118._12_4_ * auVar101._12_4_;
      auVar192._16_4_ = fVar183 * auVar101._16_4_;
      auVar192._20_4_ = fVar165 * auVar101._20_4_;
      auVar192._24_4_ = fVar178 * auVar101._24_4_;
      auVar192._28_4_ = 0;
      auVar90 = vfmsub231ps_fma(auVar192,auVar104,auVar117);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar98,auVar102);
      auVar107 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar95));
      auVar197 = ZEXT3264(auVar107);
      auVar102 = vmaxps_avx(auVar106,auVar107);
      uVar166 = vcmpps_avx512vl(auVar102,auVar98,2);
      bVar83 = bVar83 & (byte)uVar166;
      if (bVar83 != 0) {
        auVar44._4_4_ = auVar103._4_4_ * auVar99._4_4_;
        auVar44._0_4_ = auVar103._0_4_ * auVar99._0_4_;
        auVar44._8_4_ = auVar103._8_4_ * auVar99._8_4_;
        auVar44._12_4_ = auVar103._12_4_ * auVar99._12_4_;
        auVar44._16_4_ = auVar103._16_4_ * auVar99._16_4_;
        auVar44._20_4_ = auVar103._20_4_ * auVar99._20_4_;
        auVar44._24_4_ = auVar103._24_4_ * auVar99._24_4_;
        auVar44._28_4_ = auVar102._28_4_;
        auVar89 = vfmsub231ps_fma(auVar44,auVar104,auVar100);
        auVar45._4_4_ = auVar100._4_4_ * auVar101._4_4_;
        auVar45._0_4_ = auVar100._0_4_ * auVar101._0_4_;
        auVar45._8_4_ = auVar100._8_4_ * auVar101._8_4_;
        auVar45._12_4_ = auVar100._12_4_ * auVar101._12_4_;
        auVar45._16_4_ = auVar100._16_4_ * auVar101._16_4_;
        auVar45._20_4_ = auVar100._20_4_ * auVar101._20_4_;
        auVar45._24_4_ = auVar100._24_4_ * auVar101._24_4_;
        auVar45._28_4_ = auVar100._28_4_;
        auVar91 = vfmsub231ps_fma(auVar45,auVar105,auVar103);
        auVar46._4_4_ = auVar104._4_4_ * auVar105._4_4_;
        auVar46._0_4_ = auVar104._0_4_ * auVar105._0_4_;
        auVar46._8_4_ = auVar104._8_4_ * auVar105._8_4_;
        auVar46._12_4_ = auVar104._12_4_ * auVar105._12_4_;
        auVar46._16_4_ = auVar104._16_4_ * auVar105._16_4_;
        auVar46._20_4_ = auVar104._20_4_ * auVar105._20_4_;
        auVar46._24_4_ = auVar104._24_4_ * auVar105._24_4_;
        auVar46._28_4_ = auVar104._28_4_;
        auVar88 = vfmsub231ps_fma(auVar46,auVar101,auVar99);
        auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar88));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
        auVar206 = ZEXT3264(auVar102);
        auVar99 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar90),auVar109);
        auVar95 = vfmadd132ps_fma(auVar99,auVar102,auVar102);
        auVar205 = ZEXT1664(auVar95);
        auVar47._4_4_ = auVar88._4_4_ * auVar116._4_4_;
        auVar47._0_4_ = auVar88._0_4_ * auVar116._0_4_;
        auVar47._8_4_ = auVar88._8_4_ * auVar116._8_4_;
        auVar47._12_4_ = auVar88._12_4_ * auVar116._12_4_;
        auVar47._16_4_ = fVar164 * 0.0;
        auVar47._20_4_ = fVar163 * 0.0;
        auVar47._24_4_ = fVar170 * 0.0;
        auVar47._28_4_ = iVar1;
        auVar91 = vfmadd231ps_fma(auVar47,auVar110,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar111,ZEXT1632(auVar89));
        fVar170 = auVar95._0_4_;
        fVar163 = auVar95._4_4_;
        fVar164 = auVar95._8_4_;
        fVar165 = auVar95._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar165,
                                       CONCAT48(auVar91._8_4_ * fVar164,
                                                CONCAT44(auVar91._4_4_ * fVar163,
                                                         auVar91._0_4_ * fVar170))));
        auVar211 = ZEXT3264(local_560);
        auVar153._4_4_ = uVar75;
        auVar153._0_4_ = uVar75;
        auVar153._8_4_ = uVar75;
        auVar153._12_4_ = uVar75;
        auVar153._16_4_ = uVar75;
        auVar153._20_4_ = uVar75;
        auVar153._24_4_ = uVar75;
        auVar153._28_4_ = uVar75;
        uVar166 = vcmpps_avx512vl(auVar153,local_560,2);
        uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar147;
        auVar25._0_4_ = uVar147;
        auVar25._8_4_ = uVar147;
        auVar25._12_4_ = uVar147;
        auVar25._16_4_ = uVar147;
        auVar25._20_4_ = uVar147;
        auVar25._24_4_ = uVar147;
        auVar25._28_4_ = uVar147;
        uVar20 = vcmpps_avx512vl(local_560,auVar25,2);
        bVar83 = (byte)uVar166 & (byte)uVar20 & bVar83;
        if (bVar83 != 0) {
          uVar84 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar84 = bVar83 & uVar84;
          if ((char)uVar84 != '\0') {
            fVar178 = auVar106._0_4_ * fVar170;
            fVar183 = auVar106._4_4_ * fVar163;
            auVar48._4_4_ = fVar183;
            auVar48._0_4_ = fVar178;
            fVar85 = auVar106._8_4_ * fVar164;
            auVar48._8_4_ = fVar85;
            fVar86 = auVar106._12_4_ * fVar165;
            auVar48._12_4_ = fVar86;
            fVar137 = auVar106._16_4_ * 0.0;
            auVar48._16_4_ = fVar137;
            fVar138 = auVar106._20_4_ * 0.0;
            auVar48._20_4_ = fVar138;
            fVar139 = auVar106._24_4_ * 0.0;
            auVar48._24_4_ = fVar139;
            auVar48._28_4_ = auVar106._28_4_;
            auVar102 = vsubps_avx512vl(auVar109,auVar48);
            local_400._0_4_ =
                 (float)((uint)(bVar72 & 1) * (int)fVar178 |
                        (uint)!(bool)(bVar72 & 1) * auVar102._0_4_);
            bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
            local_400._4_4_ = (float)((uint)bVar12 * (int)fVar183 | (uint)!bVar12 * auVar102._4_4_);
            bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
            local_400._8_4_ = (float)((uint)bVar12 * (int)fVar85 | (uint)!bVar12 * auVar102._8_4_);
            bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
            local_400._12_4_ = (float)((uint)bVar12 * (int)fVar86 | (uint)!bVar12 * auVar102._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
            local_400._16_4_ =
                 (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar102._16_4_);
            bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
            local_400._20_4_ =
                 (float)((uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar102._20_4_);
            bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
            local_400._24_4_ =
                 (float)((uint)bVar12 * (int)fVar139 | (uint)!bVar12 * auVar102._24_4_);
            bVar12 = SUB81(uVar74 >> 7,0);
            local_400._28_4_ =
                 (float)((uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar102._28_4_);
            auVar102 = vsubps_avx(ZEXT1632(auVar180),auVar97);
            auVar95 = vfmadd213ps_fma(auVar102,local_400,auVar97);
            uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar26._4_4_ = uVar147;
            auVar26._0_4_ = uVar147;
            auVar26._8_4_ = uVar147;
            auVar26._12_4_ = uVar147;
            auVar26._16_4_ = uVar147;
            auVar26._20_4_ = uVar147;
            auVar26._24_4_ = uVar147;
            auVar26._28_4_ = uVar147;
            auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                          CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                   CONCAT44(auVar95._4_4_ +
                                                                            auVar95._4_4_,
                                                                            auVar95._0_4_ +
                                                                            auVar95._0_4_)))),
                                       auVar26);
            uVar77 = vcmpps_avx512vl(local_560,auVar102,6);
            uVar84 = uVar84 & uVar77;
            bVar83 = (byte)uVar84;
            if (bVar83 != 0) {
              auVar177._0_4_ = auVar107._0_4_ * fVar170;
              auVar177._4_4_ = auVar107._4_4_ * fVar163;
              auVar177._8_4_ = auVar107._8_4_ * fVar164;
              auVar177._12_4_ = auVar107._12_4_ * fVar165;
              auVar177._16_4_ = auVar107._16_4_ * 0.0;
              auVar177._20_4_ = auVar107._20_4_ * 0.0;
              auVar177._24_4_ = auVar107._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar102 = vsubps_avx512vl(auVar109,auVar177);
              auVar122._0_4_ =
                   (uint)(bVar72 & 1) * (int)auVar177._0_4_ |
                   (uint)!(bool)(bVar72 & 1) * auVar102._0_4_;
              bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
              auVar122._4_4_ = (uint)bVar12 * (int)auVar177._4_4_ | (uint)!bVar12 * auVar102._4_4_;
              bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
              auVar122._8_4_ = (uint)bVar12 * (int)auVar177._8_4_ | (uint)!bVar12 * auVar102._8_4_;
              bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
              auVar122._12_4_ =
                   (uint)bVar12 * (int)auVar177._12_4_ | (uint)!bVar12 * auVar102._12_4_;
              bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
              auVar122._16_4_ =
                   (uint)bVar12 * (int)auVar177._16_4_ | (uint)!bVar12 * auVar102._16_4_;
              bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
              auVar122._20_4_ =
                   (uint)bVar12 * (int)auVar177._20_4_ | (uint)!bVar12 * auVar102._20_4_;
              bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
              auVar122._24_4_ =
                   (uint)bVar12 * (int)auVar177._24_4_ | (uint)!bVar12 * auVar102._24_4_;
              auVar122._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar102._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar122,auVar109,auVar27);
              local_3a0 = 0;
              local_380 = local_680;
              uStack_378 = uStack_678;
              local_370 = local_690;
              uStack_368 = uStack_688;
              local_360 = local_6a0;
              uStack_358 = uStack_698;
              if ((pGVar79->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar170 = 1.0 / auVar212._0_4_;
                local_340[0] = fVar170 * (local_400._0_4_ + 0.0);
                local_340[1] = fVar170 * (local_400._4_4_ + 1.0);
                local_340[2] = fVar170 * (local_400._8_4_ + 2.0);
                local_340[3] = fVar170 * (local_400._12_4_ + 3.0);
                fStack_330 = fVar170 * (local_400._16_4_ + 4.0);
                fStack_32c = fVar170 * (local_400._20_4_ + 5.0);
                fStack_328 = fVar170 * (local_400._24_4_ + 6.0);
                fStack_324 = local_400._28_4_ + 7.0;
                local_320 = local_3e0;
                local_300 = local_560;
                auVar154._8_4_ = 0x7f800000;
                auVar154._0_8_ = 0x7f8000007f800000;
                auVar154._12_4_ = 0x7f800000;
                auVar154._16_4_ = 0x7f800000;
                auVar154._20_4_ = 0x7f800000;
                auVar154._24_4_ = 0x7f800000;
                auVar154._28_4_ = 0x7f800000;
                auVar102 = vblendmps_avx512vl(auVar154,local_560);
                auVar123._0_4_ =
                     (uint)(bVar83 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
                auVar123._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                auVar123._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
                auVar123._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
                auVar123._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
                auVar123._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
                auVar123._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar84 >> 7,0);
                auVar123._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar102 = vshufps_avx(auVar123,auVar123,0xb1);
                auVar102 = vminps_avx(auVar123,auVar102);
                auVar99 = vshufpd_avx(auVar102,auVar102,5);
                auVar102 = vminps_avx(auVar102,auVar99);
                auVar99 = vpermpd_avx2(auVar102,0x4e);
                auVar102 = vminps_avx(auVar102,auVar99);
                uVar166 = vcmpps_avx512vl(auVar123,auVar102,0);
                uVar75 = (uint)uVar84;
                if ((bVar83 & (byte)uVar166) != 0) {
                  uVar75 = (uint)(bVar83 & (byte)uVar166);
                }
                uVar76 = 0;
                for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                  uVar76 = uVar76 + 1;
                }
                uVar74 = (ulong)uVar76;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_540 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uStack_53c = 0;
                  uStack_538 = 0;
                  uStack_534 = 0;
                  local_5a0 = auVar96;
                  local_3c0 = local_560;
                  local_39c = iVar9;
                  local_390 = auVar87;
                  do {
                    fVar170 = local_340[uVar74];
                    auVar168._4_4_ = fVar170;
                    auVar168._0_4_ = fVar170;
                    auVar168._8_4_ = fVar170;
                    auVar168._12_4_ = fVar170;
                    local_1c0._16_4_ = fVar170;
                    local_1c0._0_16_ = auVar168;
                    local_1c0._20_4_ = fVar170;
                    local_1c0._24_4_ = fVar170;
                    local_1c0._28_4_ = fVar170;
                    local_1a0 = *(undefined4 *)(local_320 + uVar74 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4);
                    local_670.context = context->user;
                    fVar163 = 1.0 - fVar170;
                    auVar24._8_4_ = 0x80000000;
                    auVar24._0_8_ = 0x8000000080000000;
                    auVar24._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar24);
                    auVar95 = ZEXT416((uint)(fVar170 * fVar163 * 4.0));
                    auVar90 = vfnmsub213ss_fma(auVar168,auVar168,auVar95);
                    auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar95)
                    ;
                    auVar206 = ZEXT464(0x3f000000);
                    fVar163 = fVar163 * auVar91._0_4_ * 0.5;
                    fVar164 = auVar90._0_4_ * 0.5;
                    fVar165 = auVar95._0_4_ * 0.5;
                    fVar170 = fVar170 * fVar170 * 0.5;
                    auVar200._0_4_ = fVar170 * fVar146;
                    auVar200._4_4_ = fVar170 * fVar160;
                    auVar200._8_4_ = fVar170 * fVar161;
                    auVar200._12_4_ = fVar170 * fVar162;
                    auVar150._4_4_ = fVar165;
                    auVar150._0_4_ = fVar165;
                    auVar150._8_4_ = fVar165;
                    auVar150._12_4_ = fVar165;
                    auVar95 = vfmadd132ps_fma(auVar150,auVar200,auVar6);
                    auVar189._4_4_ = fVar164;
                    auVar189._0_4_ = fVar164;
                    auVar189._8_4_ = fVar164;
                    auVar189._12_4_ = fVar164;
                    auVar95 = vfmadd132ps_fma(auVar189,auVar95,auVar19);
                    auVar151._4_4_ = fVar163;
                    auVar151._0_4_ = fVar163;
                    auVar151._8_4_ = fVar163;
                    auVar151._12_4_ = fVar163;
                    auVar95 = vfmadd213ps_fma(auVar151,auVar87,auVar95);
                    local_220 = auVar95._0_4_;
                    auVar196._8_4_ = 1;
                    auVar196._0_8_ = 0x100000001;
                    auVar196._12_4_ = 1;
                    auVar196._16_4_ = 1;
                    auVar196._20_4_ = 1;
                    auVar196._24_4_ = 1;
                    auVar196._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar196,ZEXT1632(auVar95));
                    auVar197 = ZEXT3264(local_200);
                    auVar201._8_4_ = 2;
                    auVar201._0_8_ = 0x200000002;
                    auVar201._12_4_ = 2;
                    auVar204._16_4_ = 2;
                    auVar204._0_16_ = auVar201;
                    auVar204._20_4_ = 2;
                    auVar204._24_4_ = 2;
                    auVar204._28_4_ = 2;
                    auVar205 = ZEXT3264(auVar204);
                    local_1e0 = vpermps_avx2(auVar204,ZEXT1632(auVar95));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2c0._0_8_;
                    uStack_178 = local_2c0._8_8_;
                    uStack_170 = local_2c0._16_8_;
                    uStack_168 = local_2c0._24_8_;
                    local_160 = local_2a0;
                    auVar102 = vpcmpeqd_avx2(local_2a0,local_2a0);
                    local_608[1] = auVar102;
                    *local_608 = auVar102;
                    local_140 = (local_670.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_670.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_5e0 = local_2e0;
                    local_670.valid = (int *)local_5e0;
                    local_670.geometryUserPtr = *(void **)(local_600._0_8_ + 0x18);
                    local_670.hit = (RTCHitN *)&local_220;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (*(code **)(local_600._0_8_ + 0x40) != (code *)0x0) {
                      auVar197 = ZEXT1664(local_200._0_16_);
                      auVar205 = ZEXT1664(auVar201);
                      auVar206 = ZEXT1664(auVar206._0_16_);
                      (**(code **)(local_600._0_8_ + 0x40))(&local_670);
                      auVar211 = ZEXT3264(local_560);
                      auVar220 = ZEXT3264(local_5a0);
                      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar223 = ZEXT1664(auVar95);
                      auVar222 = ZEXT3264(local_520);
                      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar221 = ZEXT3264(auVar102);
                      ray = local_610;
                    }
                    if (local_5e0 == (undefined1  [32])0x0) {
LAB_019eda7b:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_540;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_600._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar197 = ZEXT1664(auVar197._0_16_);
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (*p_Var11)(&local_670);
                        auVar211 = ZEXT3264(local_560);
                        auVar220 = ZEXT3264(local_5a0);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar223 = ZEXT1664(auVar95);
                        auVar222 = ZEXT3264(local_520);
                        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar221 = ZEXT3264(auVar102);
                        ray = local_610;
                      }
                      if (local_5e0 == (undefined1  [32])0x0) goto LAB_019eda7b;
                      uVar77 = vptestmd_avx512vl(local_5e0,local_5e0);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar66 = *(int *)(local_670.hit + 0xc);
                      iVar67 = *(int *)(local_670.hit + 0x10);
                      iVar68 = *(int *)(local_670.hit + 0x14);
                      iVar69 = *(int *)(local_670.hit + 0x18);
                      iVar70 = *(int *)(local_670.hit + 0x1c);
                      bVar83 = (byte)uVar77;
                      bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      bVar18 = SUB81(uVar77 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar83 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar14 * iVar66 | (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar66 = *(int *)(local_670.hit + 0x2c);
                      iVar67 = *(int *)(local_670.hit + 0x30);
                      iVar68 = *(int *)(local_670.hit + 0x34);
                      iVar69 = *(int *)(local_670.hit + 0x38);
                      iVar70 = *(int *)(local_670.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      bVar18 = SUB81(uVar77 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar14 * iVar66 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar66 = *(int *)(local_670.hit + 0x4c);
                      iVar67 = *(int *)(local_670.hit + 0x50);
                      iVar68 = *(int *)(local_670.hit + 0x54);
                      iVar69 = *(int *)(local_670.hit + 0x58);
                      iVar70 = *(int *)(local_670.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      bVar18 = SUB81(uVar77 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar14 * iVar66 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar66 = *(int *)(local_670.hit + 0x6c);
                      iVar67 = *(int *)(local_670.hit + 0x70);
                      iVar68 = *(int *)(local_670.hit + 0x74);
                      iVar69 = *(int *)(local_670.hit + 0x78);
                      iVar70 = *(int *)(local_670.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      bVar18 = SUB81(uVar77 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar14 * iVar66 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar66 = *(int *)(local_670.hit + 0x8c);
                      iVar67 = *(int *)(local_670.hit + 0x90);
                      iVar68 = *(int *)(local_670.hit + 0x94);
                      iVar69 = *(int *)(local_670.hit + 0x98);
                      iVar70 = *(int *)(local_670.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                      bVar18 = SUB81(uVar77 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar14 * iVar66 | (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                      auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar102;
                      auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar102;
                      auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar102;
                      auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar102;
                      local_540 = *(undefined4 *)(ray + k * 4 + 0x100);
                      uStack_53c = 0;
                      uStack_538 = 0;
                      uStack_534 = 0;
                    }
                    auVar96 = auVar220._0_32_;
                    bVar83 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar84;
                    auVar158._4_4_ = local_540;
                    auVar158._0_4_ = local_540;
                    auVar158._8_4_ = local_540;
                    auVar158._12_4_ = local_540;
                    auVar158._16_4_ = local_540;
                    auVar158._20_4_ = local_540;
                    auVar158._24_4_ = local_540;
                    auVar158._28_4_ = local_540;
                    uVar166 = vcmpps_avx512vl(auVar211._0_32_,auVar158,2);
                    if ((bVar83 & (byte)uVar166) == 0) goto LAB_019ec974;
                    bVar83 = bVar83 & (byte)uVar166;
                    uVar84 = (ulong)bVar83;
                    auVar159._8_4_ = 0x7f800000;
                    auVar159._0_8_ = 0x7f8000007f800000;
                    auVar159._12_4_ = 0x7f800000;
                    auVar159._16_4_ = 0x7f800000;
                    auVar159._20_4_ = 0x7f800000;
                    auVar159._24_4_ = 0x7f800000;
                    auVar159._28_4_ = 0x7f800000;
                    auVar102 = vblendmps_avx512vl(auVar159,auVar211._0_32_);
                    auVar136._0_4_ =
                         (uint)(bVar83 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 1 & 1);
                    auVar136._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 2 & 1);
                    auVar136._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 3 & 1);
                    auVar136._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 4 & 1);
                    auVar136._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 5 & 1);
                    auVar136._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar83 >> 6 & 1);
                    auVar136._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar136._28_4_ =
                         (uint)(bVar83 >> 7) * auVar102._28_4_ |
                         (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                    auVar102 = vshufps_avx(auVar136,auVar136,0xb1);
                    auVar102 = vminps_avx(auVar136,auVar102);
                    auVar99 = vshufpd_avx(auVar102,auVar102,5);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    auVar99 = vpermpd_avx2(auVar102,0x4e);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    uVar166 = vcmpps_avx512vl(auVar136,auVar102,0);
                    bVar72 = (byte)uVar166 & bVar83;
                    if (bVar72 != 0) {
                      bVar83 = bVar72;
                    }
                    uVar75 = 0;
                    for (uVar76 = (uint)bVar83; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000
                        ) {
                      uVar75 = uVar75 + 1;
                    }
                    uVar74 = (ulong)uVar75;
                  } while( true );
                }
                fVar170 = local_340[uVar74];
                uVar147 = *(undefined4 *)(local_320 + uVar74 * 4);
                fVar163 = 1.0 - fVar170;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar21);
                auVar95 = ZEXT416((uint)(fVar170 * fVar163 * 4.0));
                auVar90 = vfnmsub213ss_fma(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),auVar95);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar95);
                fVar163 = fVar163 * auVar91._0_4_ * 0.5;
                fVar164 = auVar90._0_4_ * 0.5;
                auVar205 = ZEXT464((uint)fVar164);
                fVar165 = auVar95._0_4_ * 0.5;
                fVar178 = fVar170 * fVar170 * 0.5;
                auVar184._0_4_ = fVar178 * fVar146;
                auVar184._4_4_ = fVar178 * fVar160;
                auVar184._8_4_ = fVar178 * fVar161;
                auVar184._12_4_ = fVar178 * fVar162;
                auVar173._4_4_ = fVar165;
                auVar173._0_4_ = fVar165;
                auVar173._8_4_ = fVar165;
                auVar173._12_4_ = fVar165;
                auVar95 = vfmadd132ps_fma(auVar173,auVar184,auVar6);
                auVar185._4_4_ = fVar164;
                auVar185._0_4_ = fVar164;
                auVar185._8_4_ = fVar164;
                auVar185._12_4_ = fVar164;
                auVar95 = vfmadd132ps_fma(auVar185,auVar95,auVar19);
                auVar197 = ZEXT1664(auVar95);
                auVar174._4_4_ = fVar163;
                auVar174._0_4_ = fVar163;
                auVar174._8_4_ = fVar163;
                auVar174._12_4_ = fVar163;
                auVar95 = vfmadd213ps_fma(auVar174,auVar87,auVar95);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar95._0_4_;
                uVar10 = vextractps_avx(auVar95,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                uVar10 = vextractps_avx(auVar95,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                *(float *)(ray + k * 4 + 0x1e0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar147;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar8;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_019ec974:
                uVar75 = local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = uVar75;
    if (8 < iVar9) {
      local_600 = vpbroadcastd_avx512vl();
      local_540 = local_630._0_4_;
      uStack_53c = local_630._0_4_;
      uStack_538 = local_630._0_4_;
      uStack_534 = local_630._0_4_;
      uStack_530 = local_630._0_4_;
      uStack_52c = local_630._0_4_;
      uStack_528 = local_630._0_4_;
      uStack_524 = local_630._0_4_;
      local_560._4_4_ = local_640._0_4_;
      local_560._0_4_ = local_640._0_4_;
      local_560._8_4_ = local_640._0_4_;
      local_560._12_4_ = local_640._0_4_;
      local_560._16_4_ = local_640._0_4_;
      local_560._20_4_ = local_640._0_4_;
      local_560._24_4_ = local_640._0_4_;
      local_560._28_4_ = local_640._0_4_;
      local_100 = 1.0 / (float)local_580._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar82 = 8;
      local_5a0 = auVar96;
LAB_019eca1b:
      if (lVar82 < lVar78) {
        auVar102 = vpbroadcastd_avx512vl();
        auVar102 = vpor_avx2(auVar102,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar102,local_600,1);
        auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar82 * 4 + lVar81);
        auVar99 = *(undefined1 (*) [32])(lVar81 + 0x21fffac + lVar82 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar81 + 0x2200430 + lVar82 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar81 + 0x22008b4 + lVar82 * 4);
        auVar220._0_4_ = auVar101._0_4_ * (float)local_4e0._0_4_;
        auVar220._4_4_ = auVar101._4_4_ * (float)local_4e0._4_4_;
        auVar220._8_4_ = auVar101._8_4_ * fStack_4d8;
        auVar220._12_4_ = auVar101._12_4_ * fStack_4d4;
        auVar220._16_4_ = auVar101._16_4_ * fStack_4d0;
        auVar220._20_4_ = auVar101._20_4_ * fStack_4cc;
        auVar220._28_36_ = auVar205._28_36_;
        auVar220._24_4_ = auVar101._24_4_ * fStack_4c8;
        auVar205._0_4_ = auVar101._0_4_ * (float)local_500._0_4_;
        auVar205._4_4_ = auVar101._4_4_ * (float)local_500._4_4_;
        auVar205._8_4_ = auVar101._8_4_ * fStack_4f8;
        auVar205._12_4_ = auVar101._12_4_ * fStack_4f4;
        auVar205._16_4_ = auVar101._16_4_ * fStack_4f0;
        auVar205._20_4_ = auVar101._20_4_ * fStack_4ec;
        auVar205._28_36_ = auVar197._28_36_;
        auVar205._24_4_ = auVar101._24_4_ * fStack_4e8;
        auVar104 = vmulps_avx512vl(local_e0,auVar101);
        auVar103 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar100,local_4a0);
        auVar111 = vfmadd231ps_avx512vl(auVar205._0_32_,auVar100,local_4c0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_460);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,local_480);
        auVar110 = vfmadd231ps_avx512vl(auVar104,auVar99,local_a0);
        auVar95 = vfmadd231ps_fma(auVar103,auVar102,local_420);
        auVar205 = ZEXT1664(auVar95);
        auVar90 = vfmadd231ps_fma(auVar111,auVar102,local_440);
        auVar197 = ZEXT1664(auVar90);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar82 * 4 + lVar81);
        auVar103 = *(undefined1 (*) [32])(lVar81 + 0x22023cc + lVar82 * 4);
        auVar107 = vfmadd231ps_avx512vl(auVar110,auVar102,local_80);
        auVar111 = *(undefined1 (*) [32])(lVar81 + 0x2202850 + lVar82 * 4);
        auVar110 = *(undefined1 (*) [32])(lVar81 + 0x2202cd4 + lVar82 * 4);
        auVar211._0_4_ = auVar110._0_4_ * (float)local_4e0._0_4_;
        auVar211._4_4_ = auVar110._4_4_ * (float)local_4e0._4_4_;
        auVar211._8_4_ = auVar110._8_4_ * fStack_4d8;
        auVar211._12_4_ = auVar110._12_4_ * fStack_4d4;
        auVar211._16_4_ = auVar110._16_4_ * fStack_4d0;
        auVar211._20_4_ = auVar110._20_4_ * fStack_4cc;
        auVar211._28_36_ = auVar206._28_36_;
        auVar211._24_4_ = auVar110._24_4_ * fStack_4c8;
        auVar49._4_4_ = auVar110._4_4_ * (float)local_500._4_4_;
        auVar49._0_4_ = auVar110._0_4_ * (float)local_500._0_4_;
        auVar49._8_4_ = auVar110._8_4_ * fStack_4f8;
        auVar49._12_4_ = auVar110._12_4_ * fStack_4f4;
        auVar49._16_4_ = auVar110._16_4_ * fStack_4f0;
        auVar49._20_4_ = auVar110._20_4_ * fStack_4ec;
        auVar49._24_4_ = auVar110._24_4_ * fStack_4e8;
        auVar49._28_4_ = uStack_4e4;
        auVar105 = vmulps_avx512vl(local_e0,auVar110);
        auVar106 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar111,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar49,auVar111,local_4c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,local_c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_460);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_a0);
        auVar91 = vfmadd231ps_fma(auVar106,auVar104,local_420);
        auVar206 = ZEXT1664(auVar91);
        auVar89 = vfmadd231ps_fma(auVar98,auVar104,local_440);
        auVar98 = vfmadd231ps_avx512vl(auVar105,auVar104,local_80);
        auVar96 = vmaxps_avx512vl(auVar107,auVar98);
        auVar105 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar95));
        auVar106 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar90));
        auVar97 = vmulps_avx512vl(ZEXT1632(auVar90),auVar105);
        auVar108 = vmulps_avx512vl(ZEXT1632(auVar95),auVar106);
        auVar97 = vsubps_avx512vl(auVar97,auVar108);
        auVar108 = vmulps_avx512vl(auVar106,auVar106);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar108);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        uVar166 = vcmpps_avx512vl(auVar97,auVar96,2);
        bVar83 = (byte)uVar20 & (byte)uVar166;
        if (bVar83 != 0) {
          auVar110 = vmulps_avx512vl(local_280,auVar110);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_260,auVar110);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_240,auVar111);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_5a0,auVar103);
          auVar101 = vmulps_avx512vl(local_280,auVar101);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_260,auVar101);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_240,auVar100);
          auVar103 = vfmadd213ps_avx512vl(auVar102,local_5a0,auVar99);
          auVar102 = *(undefined1 (*) [32])(lVar81 + 0x2200d38 + lVar82 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar81 + 0x22011bc + lVar82 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar81 + 0x2201640 + lVar82 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar81 + 0x2201ac4 + lVar82 * 4);
          auVar111 = vmulps_avx512vl(_local_4e0,auVar101);
          auVar110 = vmulps_avx512vl(_local_500,auVar101);
          auVar101 = vmulps_avx512vl(local_280,auVar101);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,local_4a0);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,local_4c0);
          auVar100 = vfmadd231ps_avx512vl(auVar101,local_260,auVar100);
          auVar101 = vfmadd231ps_avx512vl(auVar111,auVar99,local_460);
          auVar111 = vfmadd231ps_avx512vl(auVar110,auVar99,local_480);
          auVar99 = vfmadd231ps_avx512vl(auVar100,local_240,auVar99);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,local_420);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_440);
          auVar88 = vfmadd231ps_fma(auVar99,auVar102,local_5a0);
          auVar102 = *(undefined1 (*) [32])(lVar81 + 0x2203158 + lVar82 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar81 + 0x2203a60 + lVar82 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar81 + 0x2203ee4 + lVar82 * 4);
          auVar110 = vmulps_avx512vl(_local_4e0,auVar100);
          auVar96 = vmulps_avx512vl(_local_500,auVar100);
          auVar100 = vmulps_avx512vl(local_280,auVar100);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,local_4a0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_4c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_260,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar81 + 0x22035dc + lVar82 * 4);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,local_460);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_480);
          auVar99 = vfmadd231ps_avx512vl(auVar100,local_240,auVar99);
          auVar100 = vfmadd231ps_avx512vl(auVar110,auVar102,local_420);
          auVar110 = vfmadd231ps_avx512vl(auVar96,auVar102,local_440);
          auVar99 = vfmadd231ps_avx512vl(auVar99,local_5a0,auVar102);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar101,auVar96);
          vandps_avx512vl(auVar111,auVar96);
          auVar102 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(ZEXT1632(auVar88),auVar96);
          auVar102 = vmaxps_avx(auVar102,auVar96);
          auVar71._4_4_ = uStack_53c;
          auVar71._0_4_ = local_540;
          auVar71._8_4_ = uStack_538;
          auVar71._12_4_ = uStack_534;
          auVar71._16_4_ = uStack_530;
          auVar71._20_4_ = uStack_52c;
          auVar71._24_4_ = uStack_528;
          auVar71._28_4_ = uStack_524;
          uVar74 = vcmpps_avx512vl(auVar102,auVar71,1);
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar124._0_4_ = (float)((uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar101._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar101._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar101._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar101._12_4_);
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar101._16_4_);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar101._20_4_);
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar101._24_4_);
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar101._28_4_;
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar125._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar111._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar111._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar111._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar111._12_4_);
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar111._16_4_);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar111._20_4_);
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar111._24_4_);
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar125._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar111._28_4_;
          vandps_avx512vl(auVar100,auVar96);
          vandps_avx512vl(auVar110,auVar96);
          auVar102 = vmaxps_avx(auVar125,auVar125);
          vandps_avx512vl(auVar99,auVar96);
          auVar102 = vmaxps_avx(auVar102,auVar125);
          uVar74 = vcmpps_avx512vl(auVar102,auVar71,1);
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar126._0_4_ = (uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar100._0_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar100._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar100._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar100._12_4_;
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar100._16_4_;
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar100._20_4_;
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar100._24_4_;
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar126._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar100._28_4_;
          bVar12 = (bool)((byte)uVar74 & 1);
          auVar127._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar110._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar110._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar110._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar110._12_4_);
          bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar110._16_4_);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar110._20_4_);
          bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar110._24_4_);
          bVar12 = SUB81(uVar74 >> 7,0);
          auVar127._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar110._28_4_;
          auVar210._8_4_ = 0x80000000;
          auVar210._0_8_ = 0x8000000080000000;
          auVar210._12_4_ = 0x80000000;
          auVar210._16_4_ = 0x80000000;
          auVar210._20_4_ = 0x80000000;
          auVar210._24_4_ = 0x80000000;
          auVar210._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar126,auVar210);
          auVar94 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
          auVar99 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar94));
          auVar88 = vfmadd231ps_fma(auVar99,auVar125,auVar125);
          auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
          auVar219._8_4_ = 0xbf000000;
          auVar219._0_8_ = 0xbf000000bf000000;
          auVar219._12_4_ = 0xbf000000;
          auVar219._16_4_ = 0xbf000000;
          auVar219._20_4_ = 0xbf000000;
          auVar219._24_4_ = 0xbf000000;
          auVar219._28_4_ = 0xbf000000;
          fVar170 = auVar99._0_4_;
          fVar163 = auVar99._4_4_;
          fVar164 = auVar99._8_4_;
          fVar165 = auVar99._12_4_;
          fVar178 = auVar99._16_4_;
          fVar183 = auVar99._20_4_;
          fVar85 = auVar99._24_4_;
          auVar50._4_4_ = fVar163 * fVar163 * fVar163 * auVar88._4_4_ * -0.5;
          auVar50._0_4_ = fVar170 * fVar170 * fVar170 * auVar88._0_4_ * -0.5;
          auVar50._8_4_ = fVar164 * fVar164 * fVar164 * auVar88._8_4_ * -0.5;
          auVar50._12_4_ = fVar165 * fVar165 * fVar165 * auVar88._12_4_ * -0.5;
          auVar50._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar50._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
          auVar50._24_4_ = fVar85 * fVar85 * fVar85 * -0.0;
          auVar50._28_4_ = auVar125._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar99 = vfmadd231ps_avx512vl(auVar50,auVar100,auVar99);
          auVar51._4_4_ = auVar125._4_4_ * auVar99._4_4_;
          auVar51._0_4_ = auVar125._0_4_ * auVar99._0_4_;
          auVar51._8_4_ = auVar125._8_4_ * auVar99._8_4_;
          auVar51._12_4_ = auVar125._12_4_ * auVar99._12_4_;
          auVar51._16_4_ = auVar125._16_4_ * auVar99._16_4_;
          auVar51._20_4_ = auVar125._20_4_ * auVar99._20_4_;
          auVar51._24_4_ = auVar125._24_4_ * auVar99._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar99._4_4_ * -auVar124._4_4_;
          auVar52._0_4_ = auVar99._0_4_ * -auVar124._0_4_;
          auVar52._8_4_ = auVar99._8_4_ * -auVar124._8_4_;
          auVar52._12_4_ = auVar99._12_4_ * -auVar124._12_4_;
          auVar52._16_4_ = auVar99._16_4_ * -auVar124._16_4_;
          auVar52._20_4_ = auVar99._20_4_ * -auVar124._20_4_;
          auVar52._24_4_ = auVar99._24_4_ * -auVar124._24_4_;
          auVar52._28_4_ = auVar125._28_4_;
          auVar101 = vmulps_avx512vl(auVar99,ZEXT1632(auVar94));
          auVar110 = ZEXT1632(auVar94);
          auVar99 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar110);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar127,auVar127);
          auVar111 = vrsqrt14ps_avx512vl(auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar219);
          fVar170 = auVar111._0_4_;
          fVar163 = auVar111._4_4_;
          fVar164 = auVar111._8_4_;
          fVar165 = auVar111._12_4_;
          fVar178 = auVar111._16_4_;
          fVar183 = auVar111._20_4_;
          fVar85 = auVar111._24_4_;
          auVar53._4_4_ = fVar163 * fVar163 * fVar163 * auVar99._4_4_;
          auVar53._0_4_ = fVar170 * fVar170 * fVar170 * auVar99._0_4_;
          auVar53._8_4_ = fVar164 * fVar164 * fVar164 * auVar99._8_4_;
          auVar53._12_4_ = fVar165 * fVar165 * fVar165 * auVar99._12_4_;
          auVar53._16_4_ = fVar178 * fVar178 * fVar178 * auVar99._16_4_;
          auVar53._20_4_ = fVar183 * fVar183 * fVar183 * auVar99._20_4_;
          auVar53._24_4_ = fVar85 * fVar85 * fVar85 * auVar99._24_4_;
          auVar53._28_4_ = auVar99._28_4_;
          auVar99 = vfmadd231ps_avx512vl(auVar53,auVar100,auVar111);
          auVar54._4_4_ = auVar127._4_4_ * auVar99._4_4_;
          auVar54._0_4_ = auVar127._0_4_ * auVar99._0_4_;
          auVar54._8_4_ = auVar127._8_4_ * auVar99._8_4_;
          auVar54._12_4_ = auVar127._12_4_ * auVar99._12_4_;
          auVar54._16_4_ = auVar127._16_4_ * auVar99._16_4_;
          auVar54._20_4_ = auVar127._20_4_ * auVar99._20_4_;
          auVar54._24_4_ = auVar127._24_4_ * auVar99._24_4_;
          auVar54._28_4_ = auVar111._28_4_;
          auVar55._4_4_ = auVar99._4_4_ * auVar102._4_4_;
          auVar55._0_4_ = auVar99._0_4_ * auVar102._0_4_;
          auVar55._8_4_ = auVar99._8_4_ * auVar102._8_4_;
          auVar55._12_4_ = auVar99._12_4_ * auVar102._12_4_;
          auVar55._16_4_ = auVar99._16_4_ * auVar102._16_4_;
          auVar55._20_4_ = auVar99._20_4_ * auVar102._20_4_;
          auVar55._24_4_ = auVar99._24_4_ * auVar102._24_4_;
          auVar55._28_4_ = auVar102._28_4_;
          auVar102 = vmulps_avx512vl(auVar99,auVar110);
          auVar88 = vfmadd213ps_fma(auVar51,auVar107,ZEXT1632(auVar95));
          auVar7 = vfmadd213ps_fma(auVar52,auVar107,ZEXT1632(auVar90));
          auVar100 = vfmadd213ps_avx512vl(auVar101,auVar107,auVar103);
          auVar111 = vfmadd213ps_avx512vl(auVar54,auVar98,ZEXT1632(auVar91));
          auVar172 = vfnmadd213ps_fma(auVar51,auVar107,ZEXT1632(auVar95));
          auVar95 = vfmadd213ps_fma(auVar55,auVar98,ZEXT1632(auVar89));
          auVar179 = vfnmadd213ps_fma(auVar52,auVar107,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar102,auVar98,auVar104);
          auVar208 = vfnmadd231ps_fma(auVar103,auVar107,auVar101);
          auVar180 = vfnmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar91));
          auVar92 = vfnmadd213ps_fma(auVar55,auVar98,ZEXT1632(auVar89));
          auVar93 = vfnmadd231ps_fma(auVar104,auVar98,auVar102);
          auVar104 = vsubps_avx512vl(auVar111,ZEXT1632(auVar172));
          auVar102 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar179));
          auVar99 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar208));
          auVar56._4_4_ = auVar102._4_4_ * auVar208._4_4_;
          auVar56._0_4_ = auVar102._0_4_ * auVar208._0_4_;
          auVar56._8_4_ = auVar102._8_4_ * auVar208._8_4_;
          auVar56._12_4_ = auVar102._12_4_ * auVar208._12_4_;
          auVar56._16_4_ = auVar102._16_4_ * 0.0;
          auVar56._20_4_ = auVar102._20_4_ * 0.0;
          auVar56._24_4_ = auVar102._24_4_ * 0.0;
          auVar56._28_4_ = auVar101._28_4_;
          auVar91 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar179),auVar99);
          auVar57._4_4_ = auVar99._4_4_ * auVar172._4_4_;
          auVar57._0_4_ = auVar99._0_4_ * auVar172._0_4_;
          auVar57._8_4_ = auVar99._8_4_ * auVar172._8_4_;
          auVar57._12_4_ = auVar99._12_4_ * auVar172._12_4_;
          auVar57._16_4_ = auVar99._16_4_ * 0.0;
          auVar57._20_4_ = auVar99._20_4_ * 0.0;
          auVar57._24_4_ = auVar99._24_4_ * 0.0;
          auVar57._28_4_ = auVar99._28_4_;
          auVar89 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar208),auVar104);
          auVar58._4_4_ = auVar179._4_4_ * auVar104._4_4_;
          auVar58._0_4_ = auVar179._0_4_ * auVar104._0_4_;
          auVar58._8_4_ = auVar179._8_4_ * auVar104._8_4_;
          auVar58._12_4_ = auVar179._12_4_ * auVar104._12_4_;
          auVar58._16_4_ = auVar104._16_4_ * 0.0;
          auVar58._20_4_ = auVar104._20_4_ * 0.0;
          auVar58._24_4_ = auVar104._24_4_ * 0.0;
          auVar58._28_4_ = auVar104._28_4_;
          auVar171 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar172),auVar102);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar171),auVar110,ZEXT1632(auVar89));
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,ZEXT1632(auVar91));
          auVar97 = ZEXT1632(auVar94);
          uVar74 = vcmpps_avx512vl(auVar102,auVar97,2);
          bVar72 = (byte)uVar74;
          fVar138 = (float)((uint)(bVar72 & 1) * auVar88._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar180._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar140 = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar180._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar143 = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar180._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar144 = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar180._12_4_);
          auVar110 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar143,CONCAT44(fVar140,fVar138))));
          fVar139 = (float)((uint)(bVar72 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar92._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar142 = (float)((uint)bVar12 * auVar7._4_4_ | (uint)!bVar12 * auVar92._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar141 = (float)((uint)bVar12 * auVar7._8_4_ | (uint)!bVar12 * auVar92._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar145 = (float)((uint)bVar12 * auVar7._12_4_ | (uint)!bVar12 * auVar92._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar141,CONCAT44(fVar142,fVar139))));
          auVar128._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar93._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar93._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar93._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar93._12_4_)
          ;
          fVar163 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar100._16_4_);
          auVar128._16_4_ = fVar163;
          fVar164 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar100._20_4_);
          auVar128._20_4_ = fVar164;
          fVar170 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar100._24_4_);
          auVar128._24_4_ = fVar170;
          iVar1 = (uint)(byte)(uVar74 >> 7) * auVar100._28_4_;
          auVar128._28_4_ = iVar1;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar172),auVar111);
          auVar129._0_4_ =
               (uint)(bVar72 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar91._0_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar91._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar91._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar91._12_4_;
          auVar129._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar102._16_4_;
          auVar129._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar102._20_4_;
          auVar129._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar102._24_4_;
          auVar129._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar179),ZEXT1632(auVar95));
          auVar130._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar130._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar88._12_4_)
          ;
          fVar183 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar102._16_4_);
          auVar130._16_4_ = fVar183;
          fVar178 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar102._20_4_);
          auVar130._20_4_ = fVar178;
          fVar165 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar102._24_4_);
          auVar130._24_4_ = fVar165;
          auVar130._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar208),ZEXT1632(auVar90));
          auVar131._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar7._0_4_);
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar7._4_4_);
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar7._8_4_);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar7._12_4_);
          fVar85 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar102._16_4_);
          auVar131._16_4_ = fVar85;
          fVar86 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar102._20_4_);
          auVar131._20_4_ = fVar86;
          fVar137 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar102._24_4_);
          auVar131._24_4_ = fVar137;
          iVar2 = (uint)(byte)(uVar74 >> 7) * auVar102._28_4_;
          auVar131._28_4_ = iVar2;
          auVar132._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar172._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar111._0_4_
          ;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar12 * (int)auVar172._4_4_ | (uint)!bVar12 * auVar111._4_4_;
          bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar12 * (int)auVar172._8_4_ | (uint)!bVar12 * auVar111._8_4_;
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar12 * (int)auVar172._12_4_ | (uint)!bVar12 * auVar111._12_4_;
          auVar132._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar111._16_4_;
          auVar132._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar111._20_4_;
          auVar132._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar111._24_4_;
          auVar132._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar111._28_4_;
          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar111 = vsubps_avx512vl(auVar132,auVar110);
          auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar179._12_4_ |
                                                  (uint)!bVar16 * auVar95._12_4_,
                                                  CONCAT48((uint)bVar14 * (int)auVar179._8_4_ |
                                                           (uint)!bVar14 * auVar95._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar179._4_4_ |
                                                                    (uint)!bVar12 * auVar95._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar179._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar95._0_4_)))),auVar105);
          auVar205 = ZEXT3264(auVar99);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar208._12_4_ |
                                                   (uint)!bVar17 * auVar90._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar208._8_4_ |
                                                            (uint)!bVar15 * auVar90._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar208._4_4_ |
                                                                     (uint)!bVar13 * auVar90._4_4_,
                                                                     (uint)(bVar72 & 1) *
                                                                     (int)auVar208._0_4_ |
                                                                     (uint)!(bool)(bVar72 & 1) *
                                                                     auVar90._0_4_)))),auVar128);
          auVar101 = vsubps_avx(auVar110,auVar129);
          auVar206 = ZEXT3264(auVar101);
          auVar104 = vsubps_avx(auVar105,auVar130);
          auVar103 = vsubps_avx(auVar128,auVar131);
          auVar59._4_4_ = auVar100._4_4_ * fVar140;
          auVar59._0_4_ = auVar100._0_4_ * fVar138;
          auVar59._8_4_ = auVar100._8_4_ * fVar143;
          auVar59._12_4_ = auVar100._12_4_ * fVar144;
          auVar59._16_4_ = auVar100._16_4_ * 0.0;
          auVar59._20_4_ = auVar100._20_4_ * 0.0;
          auVar59._24_4_ = auVar100._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar59,auVar128,auVar111);
          auVar182._0_4_ = fVar139 * auVar111._0_4_;
          auVar182._4_4_ = fVar142 * auVar111._4_4_;
          auVar182._8_4_ = fVar141 * auVar111._8_4_;
          auVar182._12_4_ = fVar145 * auVar111._12_4_;
          auVar182._16_4_ = auVar111._16_4_ * 0.0;
          auVar182._20_4_ = auVar111._20_4_ * 0.0;
          auVar182._24_4_ = auVar111._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar182,auVar110,auVar99);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar97,ZEXT1632(auVar95));
          auVar193._0_4_ = auVar99._0_4_ * auVar128._0_4_;
          auVar193._4_4_ = auVar99._4_4_ * auVar128._4_4_;
          auVar193._8_4_ = auVar99._8_4_ * auVar128._8_4_;
          auVar193._12_4_ = auVar99._12_4_ * auVar128._12_4_;
          auVar193._16_4_ = auVar99._16_4_ * fVar163;
          auVar193._20_4_ = auVar99._20_4_ * fVar164;
          auVar193._24_4_ = auVar99._24_4_ * fVar170;
          auVar193._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar193,auVar105,auVar100);
          auVar106 = vfmadd231ps_avx512vl(auVar102,auVar97,ZEXT1632(auVar95));
          auVar102 = vmulps_avx512vl(auVar103,auVar129);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar101,auVar131);
          auVar60._4_4_ = auVar104._4_4_ * auVar131._4_4_;
          auVar60._0_4_ = auVar104._0_4_ * auVar131._0_4_;
          auVar60._8_4_ = auVar104._8_4_ * auVar131._8_4_;
          auVar60._12_4_ = auVar104._12_4_ * auVar131._12_4_;
          auVar60._16_4_ = auVar104._16_4_ * fVar85;
          auVar60._20_4_ = auVar104._20_4_ * fVar86;
          auVar60._24_4_ = auVar104._24_4_ * fVar137;
          auVar60._28_4_ = iVar2;
          auVar95 = vfmsub231ps_fma(auVar60,auVar130,auVar103);
          auVar194._0_4_ = auVar130._0_4_ * auVar101._0_4_;
          auVar194._4_4_ = auVar130._4_4_ * auVar101._4_4_;
          auVar194._8_4_ = auVar130._8_4_ * auVar101._8_4_;
          auVar194._12_4_ = auVar130._12_4_ * auVar101._12_4_;
          auVar194._16_4_ = fVar183 * auVar101._16_4_;
          auVar194._20_4_ = fVar178 * auVar101._20_4_;
          auVar194._24_4_ = fVar165 * auVar101._24_4_;
          auVar194._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar194,auVar104,auVar129);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar97,auVar102);
          auVar96 = vfmadd231ps_avx512vl(auVar102,auVar97,ZEXT1632(auVar95));
          auVar197 = ZEXT3264(auVar96);
          auVar102 = vmaxps_avx(auVar106,auVar96);
          uVar166 = vcmpps_avx512vl(auVar102,auVar97,2);
          bVar83 = bVar83 & (byte)uVar166;
          if (bVar83 != 0) {
            auVar61._4_4_ = auVar103._4_4_ * auVar99._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar99._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar99._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar99._12_4_;
            auVar61._16_4_ = auVar103._16_4_ * auVar99._16_4_;
            auVar61._20_4_ = auVar103._20_4_ * auVar99._20_4_;
            auVar61._24_4_ = auVar103._24_4_ * auVar99._24_4_;
            auVar61._28_4_ = auVar102._28_4_;
            auVar89 = vfmsub231ps_fma(auVar61,auVar104,auVar100);
            auVar62._4_4_ = auVar100._4_4_ * auVar101._4_4_;
            auVar62._0_4_ = auVar100._0_4_ * auVar101._0_4_;
            auVar62._8_4_ = auVar100._8_4_ * auVar101._8_4_;
            auVar62._12_4_ = auVar100._12_4_ * auVar101._12_4_;
            auVar62._16_4_ = auVar100._16_4_ * auVar101._16_4_;
            auVar62._20_4_ = auVar100._20_4_ * auVar101._20_4_;
            auVar62._24_4_ = auVar100._24_4_ * auVar101._24_4_;
            auVar62._28_4_ = auVar100._28_4_;
            auVar91 = vfmsub231ps_fma(auVar62,auVar111,auVar103);
            auVar63._4_4_ = auVar104._4_4_ * auVar111._4_4_;
            auVar63._0_4_ = auVar104._0_4_ * auVar111._0_4_;
            auVar63._8_4_ = auVar104._8_4_ * auVar111._8_4_;
            auVar63._12_4_ = auVar104._12_4_ * auVar111._12_4_;
            auVar63._16_4_ = auVar104._16_4_ * auVar111._16_4_;
            auVar63._20_4_ = auVar104._20_4_ * auVar111._20_4_;
            auVar63._24_4_ = auVar104._24_4_ * auVar111._24_4_;
            auVar63._28_4_ = auVar104._28_4_;
            auVar88 = vfmsub231ps_fma(auVar63,auVar101,auVar99);
            auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar88));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar89),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
            auVar206 = ZEXT3264(auVar102);
            auVar100 = auVar221._0_32_;
            auVar99 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar90),auVar100);
            auVar95 = vfmadd132ps_fma(auVar99,auVar102,auVar102);
            auVar205 = ZEXT1664(auVar95);
            auVar64._4_4_ = auVar88._4_4_ * auVar128._4_4_;
            auVar64._0_4_ = auVar88._0_4_ * auVar128._0_4_;
            auVar64._8_4_ = auVar88._8_4_ * auVar128._8_4_;
            auVar64._12_4_ = auVar88._12_4_ * auVar128._12_4_;
            auVar64._16_4_ = fVar163 * 0.0;
            auVar64._20_4_ = fVar164 * 0.0;
            auVar64._24_4_ = fVar170 * 0.0;
            auVar64._28_4_ = iVar1;
            auVar91 = vfmadd231ps_fma(auVar64,auVar105,ZEXT1632(auVar91));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar110,ZEXT1632(auVar89));
            fVar170 = auVar95._0_4_;
            fVar163 = auVar95._4_4_;
            fVar164 = auVar95._8_4_;
            fVar165 = auVar95._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar165,
                                           CONCAT48(auVar91._8_4_ * fVar164,
                                                    CONCAT44(auVar91._4_4_ * fVar163,
                                                             auVar91._0_4_ * fVar170))));
            auVar220 = ZEXT3264(local_3c0);
            uVar166 = vcmpps_avx512vl(local_3c0,local_560,0xd);
            uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar29._4_4_ = uVar147;
            auVar29._0_4_ = uVar147;
            auVar29._8_4_ = uVar147;
            auVar29._12_4_ = uVar147;
            auVar29._16_4_ = uVar147;
            auVar29._20_4_ = uVar147;
            auVar29._24_4_ = uVar147;
            auVar29._28_4_ = uVar147;
            uVar20 = vcmpps_avx512vl(local_3c0,auVar29,2);
            bVar83 = (byte)uVar166 & (byte)uVar20 & bVar83;
            if (bVar83 != 0) {
              uVar84 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar84 = bVar83 & uVar84;
              if ((char)uVar84 != '\0') {
                fVar178 = auVar106._0_4_ * fVar170;
                fVar183 = auVar106._4_4_ * fVar163;
                auVar65._4_4_ = fVar183;
                auVar65._0_4_ = fVar178;
                fVar85 = auVar106._8_4_ * fVar164;
                auVar65._8_4_ = fVar85;
                fVar86 = auVar106._12_4_ * fVar165;
                auVar65._12_4_ = fVar86;
                fVar137 = auVar106._16_4_ * 0.0;
                auVar65._16_4_ = fVar137;
                fVar138 = auVar106._20_4_ * 0.0;
                auVar65._20_4_ = fVar138;
                fVar139 = auVar106._24_4_ * 0.0;
                auVar65._24_4_ = fVar139;
                auVar65._28_4_ = auVar106._28_4_;
                auVar102 = vsubps_avx512vl(auVar100,auVar65);
                local_400._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar178 |
                            (uint)!(bool)(bVar72 & 1) * auVar102._0_4_);
                bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar12 * (int)fVar183 | (uint)!bVar12 * auVar102._4_4_);
                bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar12 * (int)fVar85 | (uint)!bVar12 * auVar102._8_4_);
                bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar12 * (int)fVar86 | (uint)!bVar12 * auVar102._12_4_);
                bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar102._16_4_);
                bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar102._20_4_);
                bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar12 * (int)fVar139 | (uint)!bVar12 * auVar102._24_4_);
                bVar12 = SUB81(uVar74 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar102._28_4_);
                auVar102 = vsubps_avx(auVar98,auVar107);
                auVar95 = vfmadd213ps_fma(auVar102,local_400,auVar107);
                uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar30._4_4_ = uVar147;
                auVar30._0_4_ = uVar147;
                auVar30._8_4_ = uVar147;
                auVar30._12_4_ = uVar147;
                auVar30._16_4_ = uVar147;
                auVar30._20_4_ = uVar147;
                auVar30._24_4_ = uVar147;
                auVar30._28_4_ = uVar147;
                auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                              CONCAT48(auVar95._8_4_ + auVar95._8_4_
                                                                       ,CONCAT44(auVar95._4_4_ +
                                                                                 auVar95._4_4_,
                                                                                 auVar95._0_4_ +
                                                                                 auVar95._0_4_)))),
                                           auVar30);
                uVar77 = vcmpps_avx512vl(local_3c0,auVar102,6);
                uVar84 = uVar84 & uVar77;
                bVar83 = (byte)uVar84;
                if (bVar83 != 0) {
                  auVar169._0_4_ = auVar96._0_4_ * fVar170;
                  auVar169._4_4_ = auVar96._4_4_ * fVar163;
                  auVar169._8_4_ = auVar96._8_4_ * fVar164;
                  auVar169._12_4_ = auVar96._12_4_ * fVar165;
                  auVar169._16_4_ = auVar96._16_4_ * 0.0;
                  auVar169._20_4_ = auVar96._20_4_ * 0.0;
                  auVar169._24_4_ = auVar96._24_4_ * 0.0;
                  auVar169._28_4_ = 0;
                  auVar102 = vsubps_avx512vl(auVar100,auVar169);
                  auVar133._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar169._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar102._0_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                  auVar133._4_4_ =
                       (uint)bVar12 * (int)auVar169._4_4_ | (uint)!bVar12 * auVar102._4_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 2) & 1);
                  auVar133._8_4_ =
                       (uint)bVar12 * (int)auVar169._8_4_ | (uint)!bVar12 * auVar102._8_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
                  auVar133._12_4_ =
                       (uint)bVar12 * (int)auVar169._12_4_ | (uint)!bVar12 * auVar102._12_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 4) & 1);
                  auVar133._16_4_ =
                       (uint)bVar12 * (int)auVar169._16_4_ | (uint)!bVar12 * auVar102._16_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
                  auVar133._20_4_ =
                       (uint)bVar12 * (int)auVar169._20_4_ | (uint)!bVar12 * auVar102._20_4_;
                  bVar12 = (bool)((byte)(uVar74 >> 6) & 1);
                  auVar133._24_4_ =
                       (uint)bVar12 * (int)auVar169._24_4_ | (uint)!bVar12 * auVar102._24_4_;
                  auVar133._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar102._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar133,auVar100,auVar31);
                  local_3a0 = (undefined4)lVar82;
                  local_380 = local_680;
                  uStack_378 = uStack_678;
                  local_370 = local_690;
                  uStack_368 = uStack_688;
                  local_360 = local_6a0;
                  uStack_358 = uStack_698;
                  pGVar79 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar79->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar95 = vcvtsi2ss_avx512f(auVar94,local_3a0);
                    fVar170 = auVar95._0_4_;
                    local_340[0] = (fVar170 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar170 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar170 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar170 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar170 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar170 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar170 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar170 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar102 = vblendmps_avx512vl(auVar155,local_3c0);
                    auVar134._0_4_ =
                         (uint)(bVar83 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
                    auVar134._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                    auVar134._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
                    auVar134._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
                    auVar134._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
                    auVar134._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
                    auVar134._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar84 >> 7,0);
                    auVar134._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar102 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar102 = vminps_avx(auVar134,auVar102);
                    auVar99 = vshufpd_avx(auVar102,auVar102,5);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    auVar99 = vpermpd_avx2(auVar102,0x4e);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    uVar166 = vcmpps_avx512vl(auVar134,auVar102,0);
                    uVar75 = (uint)uVar84;
                    if ((bVar83 & (byte)uVar166) != 0) {
                      uVar75 = (uint)(bVar83 & (byte)uVar166);
                    }
                    uVar76 = 0;
                    for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                      uVar76 = uVar76 + 1;
                    }
                    uVar74 = (ulong)uVar76;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_618 = pGVar79;
                      local_5a8 = lVar78;
                      local_580 = local_3c0;
                      local_39c = iVar9;
                      local_390 = auVar87;
                      do {
                        fVar170 = local_340[uVar74];
                        auVar167._4_4_ = fVar170;
                        auVar167._0_4_ = fVar170;
                        auVar167._8_4_ = fVar170;
                        auVar167._12_4_ = fVar170;
                        local_1c0._16_4_ = fVar170;
                        local_1c0._0_16_ = auVar167;
                        local_1c0._20_4_ = fVar170;
                        local_1c0._24_4_ = fVar170;
                        local_1c0._28_4_ = fVar170;
                        local_1a0 = *(undefined4 *)(local_320 + uVar74 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar74 * 4);
                        local_670.context = context->user;
                        fVar163 = 1.0 - fVar170;
                        auVar23._8_4_ = 0x80000000;
                        auVar23._0_8_ = 0x8000000080000000;
                        auVar23._12_4_ = 0x80000000;
                        auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar23);
                        auVar95 = ZEXT416((uint)(fVar170 * fVar163 * 4.0));
                        auVar90 = vfnmsub213ss_fma(auVar167,auVar167,auVar95);
                        auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                                  auVar95);
                        auVar206 = ZEXT464(0x3f000000);
                        fVar163 = fVar163 * auVar91._0_4_ * 0.5;
                        fVar164 = auVar90._0_4_ * 0.5;
                        fVar165 = auVar95._0_4_ * 0.5;
                        fVar170 = fVar170 * fVar170 * 0.5;
                        auVar198._0_4_ = fVar170 * fVar146;
                        auVar198._4_4_ = fVar170 * fVar160;
                        auVar198._8_4_ = fVar170 * fVar161;
                        auVar198._12_4_ = fVar170 * fVar162;
                        auVar148._4_4_ = fVar165;
                        auVar148._0_4_ = fVar165;
                        auVar148._8_4_ = fVar165;
                        auVar148._12_4_ = fVar165;
                        auVar95 = vfmadd132ps_fma(auVar148,auVar198,auVar6);
                        auVar188._4_4_ = fVar164;
                        auVar188._0_4_ = fVar164;
                        auVar188._8_4_ = fVar164;
                        auVar188._12_4_ = fVar164;
                        auVar95 = vfmadd132ps_fma(auVar188,auVar95,auVar19);
                        auVar149._4_4_ = fVar163;
                        auVar149._0_4_ = fVar163;
                        auVar149._8_4_ = fVar163;
                        auVar149._12_4_ = fVar163;
                        auVar95 = vfmadd213ps_fma(auVar149,auVar87,auVar95);
                        local_220 = auVar95._0_4_;
                        auVar195._8_4_ = 1;
                        auVar195._0_8_ = 0x100000001;
                        auVar195._12_4_ = 1;
                        auVar195._16_4_ = 1;
                        auVar195._20_4_ = 1;
                        auVar195._24_4_ = 1;
                        auVar195._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar95));
                        auVar197 = ZEXT3264(local_200);
                        auVar199._8_4_ = 2;
                        auVar199._0_8_ = 0x200000002;
                        auVar199._12_4_ = 2;
                        auVar203._16_4_ = 2;
                        auVar203._0_16_ = auVar199;
                        auVar203._20_4_ = 2;
                        auVar203._24_4_ = 2;
                        auVar203._28_4_ = 2;
                        auVar205 = ZEXT3264(auVar203);
                        local_1e0 = vpermps_avx2(auVar203,ZEXT1632(auVar95));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2c0._0_8_;
                        uStack_178 = local_2c0._8_8_;
                        uStack_170 = local_2c0._16_8_;
                        uStack_168 = local_2c0._24_8_;
                        local_160 = local_2a0;
                        auVar102 = vpcmpeqd_avx2(local_2a0,local_2a0);
                        local_608[1] = auVar102;
                        *local_608 = auVar102;
                        local_140 = (local_670.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_670.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_5e0 = local_2e0;
                        local_670.valid = (int *)local_5e0;
                        local_670.geometryUserPtr = pGVar79->userPtr;
                        local_670.hit = (RTCHitN *)&local_220;
                        local_670.N = 8;
                        local_630._0_8_ = uVar74;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar197 = ZEXT1664(local_200._0_16_);
                          auVar205 = ZEXT1664(auVar199);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*pGVar79->intersectionFilterN)(&local_670);
                          auVar220 = ZEXT3264(local_580);
                          pGVar79 = local_618;
                          uVar74 = local_630._0_8_;
                        }
                        uVar75 = (uint)uVar74;
                        if (local_5e0 == (undefined1  [32])0x0) {
LAB_019ed62e:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar79->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            (*p_Var11)(&local_670);
                            auVar220 = ZEXT3264(local_580);
                            pGVar79 = local_618;
                            uVar75 = local_630._0_4_;
                          }
                          if (local_5e0 == (undefined1  [32])0x0) goto LAB_019ed62e;
                          uVar74 = vptestmd_avx512vl(local_5e0,local_5e0);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar66 = *(int *)(local_670.hit + 0xc);
                          iVar67 = *(int *)(local_670.hit + 0x10);
                          iVar68 = *(int *)(local_670.hit + 0x14);
                          iVar69 = *(int *)(local_670.hit + 0x18);
                          iVar70 = *(int *)(local_670.hit + 0x1c);
                          bVar83 = (byte)uVar74;
                          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar18 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar83 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar14 * iVar66 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar66 = *(int *)(local_670.hit + 0x2c);
                          iVar67 = *(int *)(local_670.hit + 0x30);
                          iVar68 = *(int *)(local_670.hit + 0x34);
                          iVar69 = *(int *)(local_670.hit + 0x38);
                          iVar70 = *(int *)(local_670.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar18 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar14 * iVar66 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar66 = *(int *)(local_670.hit + 0x4c);
                          iVar67 = *(int *)(local_670.hit + 0x50);
                          iVar68 = *(int *)(local_670.hit + 0x54);
                          iVar69 = *(int *)(local_670.hit + 0x58);
                          iVar70 = *(int *)(local_670.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar18 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar14 * iVar66 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar66 = *(int *)(local_670.hit + 0x6c);
                          iVar67 = *(int *)(local_670.hit + 0x70);
                          iVar68 = *(int *)(local_670.hit + 0x74);
                          iVar69 = *(int *)(local_670.hit + 0x78);
                          iVar70 = *(int *)(local_670.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar18 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar14 * iVar66 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar66 = *(int *)(local_670.hit + 0x8c);
                          iVar67 = *(int *)(local_670.hit + 0x90);
                          iVar68 = *(int *)(local_670.hit + 0x94);
                          iVar69 = *(int *)(local_670.hit + 0x98);
                          iVar70 = *(int *)(local_670.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar18 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar83 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar14 * iVar66 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar15 * iVar67 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar16 * iVar68 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar17 * iVar69 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar18 * iVar70 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                          auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar102;
                          auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar102;
                          auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar102;
                          auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar102;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        bVar83 = ~(byte)(1 << (uVar75 & 0x1f)) & (byte)uVar84;
                        auVar156._4_4_ = local_640._0_4_;
                        auVar156._0_4_ = local_640._0_4_;
                        auVar156._8_4_ = local_640._0_4_;
                        auVar156._12_4_ = local_640._0_4_;
                        auVar156._16_4_ = local_640._0_4_;
                        auVar156._20_4_ = local_640._0_4_;
                        auVar156._24_4_ = local_640._0_4_;
                        auVar156._28_4_ = local_640._0_4_;
                        uVar166 = vcmpps_avx512vl(auVar220._0_32_,auVar156,2);
                        if ((bVar83 & (byte)uVar166) == 0) goto LAB_019ed6cb;
                        bVar83 = bVar83 & (byte)uVar166;
                        uVar84 = (ulong)bVar83;
                        auVar157._8_4_ = 0x7f800000;
                        auVar157._0_8_ = 0x7f8000007f800000;
                        auVar157._12_4_ = 0x7f800000;
                        auVar157._16_4_ = 0x7f800000;
                        auVar157._20_4_ = 0x7f800000;
                        auVar157._24_4_ = 0x7f800000;
                        auVar157._28_4_ = 0x7f800000;
                        auVar102 = vblendmps_avx512vl(auVar157,auVar220._0_32_);
                        auVar135._0_4_ =
                             (uint)(bVar83 & 1) * auVar102._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 1 & 1);
                        auVar135._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 2 & 1);
                        auVar135._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 3 & 1);
                        auVar135._12_4_ =
                             (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 4 & 1);
                        auVar135._16_4_ =
                             (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 5 & 1);
                        auVar135._20_4_ =
                             (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar83 >> 6 & 1);
                        auVar135._24_4_ =
                             (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar135._28_4_ =
                             (uint)(bVar83 >> 7) * auVar102._28_4_ |
                             (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                        auVar102 = vshufps_avx(auVar135,auVar135,0xb1);
                        auVar102 = vminps_avx(auVar135,auVar102);
                        auVar99 = vshufpd_avx(auVar102,auVar102,5);
                        auVar102 = vminps_avx(auVar102,auVar99);
                        auVar99 = vpermpd_avx2(auVar102,0x4e);
                        auVar102 = vminps_avx(auVar102,auVar99);
                        uVar166 = vcmpps_avx512vl(auVar135,auVar102,0);
                        bVar72 = (byte)uVar166 & bVar83;
                        if (bVar72 != 0) {
                          bVar83 = bVar72;
                        }
                        uVar75 = 0;
                        for (uVar76 = (uint)bVar83; (uVar76 & 1) == 0;
                            uVar76 = uVar76 >> 1 | 0x80000000) {
                          uVar75 = uVar75 + 1;
                        }
                        uVar74 = (ulong)uVar75;
                      } while( true );
                    }
                    fVar170 = local_340[uVar74];
                    uVar147 = *(undefined4 *)(local_320 + uVar74 * 4);
                    fVar163 = 1.0 - fVar170;
                    auVar22._8_4_ = 0x80000000;
                    auVar22._0_8_ = 0x8000000080000000;
                    auVar22._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar22);
                    auVar95 = ZEXT416((uint)(fVar170 * fVar163 * 4.0));
                    auVar90 = vfnmsub213ss_fma(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),auVar95
                                              );
                    auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar95)
                    ;
                    fVar163 = fVar163 * auVar91._0_4_ * 0.5;
                    fVar164 = auVar90._0_4_ * 0.5;
                    auVar205 = ZEXT464((uint)fVar164);
                    fVar165 = auVar95._0_4_ * 0.5;
                    fVar178 = fVar170 * fVar170 * 0.5;
                    auVar186._0_4_ = fVar178 * fVar146;
                    auVar186._4_4_ = fVar178 * fVar160;
                    auVar186._8_4_ = fVar178 * fVar161;
                    auVar186._12_4_ = fVar178 * fVar162;
                    auVar175._4_4_ = fVar165;
                    auVar175._0_4_ = fVar165;
                    auVar175._8_4_ = fVar165;
                    auVar175._12_4_ = fVar165;
                    auVar95 = vfmadd132ps_fma(auVar175,auVar186,auVar6);
                    auVar187._4_4_ = fVar164;
                    auVar187._0_4_ = fVar164;
                    auVar187._8_4_ = fVar164;
                    auVar187._12_4_ = fVar164;
                    auVar95 = vfmadd132ps_fma(auVar187,auVar95,auVar19);
                    auVar197 = ZEXT1664(auVar95);
                    auVar176._4_4_ = fVar163;
                    auVar176._0_4_ = fVar163;
                    auVar176._8_4_ = fVar163;
                    auVar176._12_4_ = fVar163;
                    auVar95 = vfmadd213ps_fma(auVar176,auVar87,auVar95);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar95._0_4_;
                    uVar10 = vextractps_avx(auVar95,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar95,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar170;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar147;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar8;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019ed301;
      }
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar28._4_4_ = uVar3;
    auVar28._0_4_ = uVar3;
    auVar28._8_4_ = uVar3;
    auVar28._12_4_ = uVar3;
    auVar28._16_4_ = uVar3;
    auVar28._20_4_ = uVar3;
    auVar28._24_4_ = uVar3;
    auVar28._28_4_ = uVar3;
    uVar166 = vcmpps_avx512vl(auVar222._0_32_,auVar28,2);
    uVar80 = (ulong)((uint)uVar80 & (uint)uVar166);
  } while( true );
LAB_019ed6cb:
  auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar221 = ZEXT3264(auVar102);
  auVar222 = ZEXT3264(local_520);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar223 = ZEXT1664(auVar95);
  lVar78 = local_5a8;
LAB_019ed301:
  lVar82 = lVar82 + 8;
  goto LAB_019eca1b;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }